

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

void secp256k1_ellswift_xswiftec_frac_var
               (secp256k1_fe *xn,secp256k1_fe *xd,secp256k1_fe *u,secp256k1_fe *t)

{
  uchar (*pk_parity) [4];
  undefined1 auVar1 [16];
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  undefined4 uVar5;
  uint64_t uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  FILE *__stream;
  size_t sVar13;
  secp256k1_ge *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_context *psVar16;
  secp256k1_scratch *psVar17;
  size_t sVar18;
  void *pvVar19;
  void *pvVar20;
  byte *pbVar21;
  void *pvVar22;
  byte *pbVar23;
  ulong uVar24;
  secp256k1_fe *a;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  secp256k1_scalar *psVar25;
  secp256k1_context *extraout_RDX;
  int iVar26;
  uchar auVar27 [4];
  secp256k1_gej *psVar28;
  secp256k1_gej *psVar29;
  secp256k1_ge_storage (*r) [2];
  _func_void_char_ptr_void_ptr *p_Var30;
  secp256k1_keypair *keypair;
  uint uVar31;
  long lVar32;
  undefined1 *puVar33;
  uint uVar34;
  ulong uVar35;
  secp256k1_fe *psVar36;
  secp256k1_scalar *psVar37;
  undefined1 *puVar38;
  uint64_t *puVar39;
  secp256k1_ge *psVar40;
  undefined8 *puVar41;
  byte *pbVar42;
  ulong uVar43;
  ulong uVar44;
  secp256k1_context *psVar45;
  secp256k1_ge *psVar46;
  ulong in_R8;
  secp256k1_scratch *na;
  uint64_t uVar47;
  ulong uVar48;
  char cVar49;
  secp256k1_fe *psVar50;
  secp256k1_fe *r_00;
  secp256k1_gej *r_01;
  secp256k1_scalar sVar51;
  secp256k1_fe *a_00;
  char *pcVar52;
  uchar *puVar53;
  secp256k1_context *a_01;
  secp256k1_xonly_pubkey *psVar54;
  bool bVar55;
  byte bVar56;
  undefined1 auVar57 [16];
  secp256k1_fe s;
  secp256k1_fe u1;
  secp256k1_fe d;
  secp256k1_fe g;
  FILE *pFStack_1e70;
  ulong uStack_1e68;
  ulong uStack_1e60;
  uchar auStack_1e54 [4];
  secp256k1_context *psStack_1e50;
  undefined1 auStack_1e44 [4];
  undefined1 *puStack_1e40;
  undefined1 *puStack_1e38;
  secp256k1_gej *psStack_1e30;
  secp256k1_scalar sStack_1e24;
  undefined1 auStack_1e20 [32];
  undefined1 auStack_1e00 [16];
  undefined1 auStack_1df0 [16];
  undefined1 auStack_1de0 [16];
  undefined4 uStack_1dd0;
  undefined1 auStack_1dc0 [16];
  undefined1 auStack_1db0 [16];
  int iStack_1d94;
  undefined1 auStack_1d90 [96];
  undefined1 auStack_1d30 [16];
  undefined1 auStack_1d20 [16];
  uint64_t uStack_1d08;
  undefined4 uStack_1cfc;
  ulong uStack_1cf8;
  _func_void_char_ptr_void_ptr *p_Stack_1cf0;
  uint64_t *puStack_1ce8;
  _func_void_char_ptr_void_ptr *p_Stack_1ce0;
  secp256k1_scratch *psStack_1cd8;
  ulong uStack_1cd0;
  secp256k1_scratch *psStack_1cc8;
  undefined1 *puStack_1cc0;
  ulong uStack_1cb8;
  undefined1 auStack_1cb0 [16];
  undefined1 auStack_1ca0 [16];
  undefined1 auStack_1c90 [16];
  undefined1 auStack_1c80 [16];
  undefined1 auStack_1b50 [32];
  byte abStack_1b30 [8];
  undefined8 auStack_1b28 [3];
  undefined1 auStack_1b10 [16];
  undefined1 auStack_1b00 [16];
  uchar auStack_1af0 [4];
  uchar auStack_1aec [4];
  int iStack_1ae8;
  int iStack_1ae4;
  secp256k1_keypair sStack_1870;
  secp256k1_context asStack_1810 [5];
  undefined1 auStack_1390 [16];
  undefined1 auStack_1380 [16];
  uint64_t uStack_1370;
  uint64_t uStack_1368;
  undefined1 auStack_1360 [32];
  undefined4 uStack_1340;
  undefined4 uStack_133c;
  int iStack_1338;
  int iStack_1334;
  int iStack_1330;
  undefined1 auStack_1090 [32];
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  int iStack_1068;
  int iStack_1064;
  uchar auStack_1060 [8];
  size_t asStack_1058 [2];
  size_t sStack_1048;
  uchar auStack_1040 [4];
  uchar auStack_103c [4];
  int aiStack_1038 [4];
  secp256k1_context asStack_1028 [5];
  secp256k1_ge sStack_bb0;
  undefined1 auStack_b48 [8];
  undefined1 auStack_b40 [152];
  secp256k1_context asStack_aa8 [9];
  secp256k1_gej *psStack_388;
  secp256k1_fe *psStack_380;
  secp256k1_gej *psStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  code *pcStack_360;
  secp256k1_gej *psStack_358;
  secp256k1_gej *psStack_348;
  secp256k1_gej *psStack_338;
  undefined1 auStack_330 [24];
  uint64_t uStack_318;
  uint64_t uStack_310;
  int iStack_308;
  int iStack_304;
  secp256k1_fe sStack_300;
  undefined1 auStack_2d0 [24];
  uint64_t uStack_2b8;
  uint64_t uStack_2b0;
  int iStack_2a8;
  int iStack_2a4;
  secp256k1_fe sStack_270;
  int iStack_240;
  secp256k1_ge sStack_230;
  secp256k1_gej *psStack_1c8;
  secp256k1_fe *psStack_1c0;
  secp256k1_fe *psStack_1b8;
  secp256k1_fe *psStack_1b0;
  undefined1 *puStack_1a8;
  code *pcStack_1a0;
  secp256k1_gej *local_190;
  undefined1 local_188 [152];
  uint64_t uStack_f0;
  uint64_t local_e8;
  uint64_t uStack_e0;
  uint64_t local_d8;
  int iStack_d0;
  secp256k1_fe local_c8;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  bVar56 = 0;
  r_00 = (secp256k1_fe *)0xf000000000000;
  local_c8.n[0] = u->n[0];
  local_c8.n[1] = u->n[1];
  local_c8.n[2] = u->n[2];
  local_c8.n[3] = u->n[3];
  local_c8.n[4] = u->n[4];
  local_c8.magnitude = u->magnitude;
  local_c8.normalized = u->normalized;
  pcStack_1a0 = (code *)0x1111c8;
  local_190 = (secp256k1_gej *)xn;
  secp256k1_fe_verify(&local_c8);
  psVar28 = (secp256k1_gej *)0x1000003d1;
  uVar11 = (local_c8.n[4] >> 0x30) * 0x1000003d1 + local_c8.n[0];
  psVar50 = (secp256k1_fe *)0xffffefffffc2f;
  if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
    uVar24 = (uVar11 >> 0x34) + local_c8.n[1];
    uVar35 = (uVar24 >> 0x34) + local_c8.n[2];
    uVar43 = (uVar35 >> 0x34) + local_c8.n[3];
    in_R8 = (uVar43 >> 0x34) + (local_c8.n[4] & 0xffffffffffff);
    if (((uVar24 | uVar11 | uVar35 | uVar43) & 0xfffffffffffff) == 0 && in_R8 == 0)
    goto LAB_001118dc;
    in_R8 = in_R8 ^ 0xf000000000000;
    if (((uVar11 | 0x1000003d0) & uVar24 & uVar35 & uVar43 & in_R8) == 0xfffffffffffff)
    goto LAB_001118dc;
  }
  do {
    pcStack_1a0 = (code *)0x11128e;
    secp256k1_fe_sqr((secp256k1_fe *)(local_188 + 0x90),t);
    pcStack_1a0 = (code *)0x111296;
    secp256k1_fe_verify(t);
    uVar11 = (t->n[4] >> 0x30) * 0x1000003d1 + t->n[0];
    if (((secp256k1_fe *)(uVar11 & 0xfffffffffffff) == psVar50) ||
       ((secp256k1_fe *)(uVar11 & 0xfffffffffffff) == (secp256k1_fe *)0x0)) {
      uVar24 = (uVar11 >> 0x34) + t->n[1];
      uVar35 = (uVar24 >> 0x34) + t->n[2];
      uVar43 = (uVar35 >> 0x34) + t->n[3];
      in_R8 = (uVar43 >> 0x34) + (t->n[4] & 0xffffffffffff);
      if ((((uVar24 | uVar11 | uVar35 | uVar43) & 0xfffffffffffff) == 0 && in_R8 == 0) ||
         (in_R8 = in_R8 ^ (ulong)r_00,
         ((uVar11 | 0x1000003d0) & uVar24 & uVar35 & uVar43 & in_R8) == 0xfffffffffffff)) {
        local_d8 = 0;
        iStack_d0 = 1;
        unique0x10002fd0 = 1;
        local_e8 = 0;
        uStack_e0 = 0;
        local_188._144_8_ = 1;
        uStack_f0 = 0;
      }
    }
    pcStack_1a0 = (code *)0x111345;
    secp256k1_fe_sqr((secp256k1_fe *)local_188,&local_c8);
    r_00 = &local_60;
    pcStack_1a0 = (code *)0x11135b;
    secp256k1_fe_mul(r_00,(secp256k1_fe *)local_188,&local_c8);
    pcStack_1a0 = (code *)0x111363;
    secp256k1_fe_verify(r_00);
    local_60.n[0] = local_60.n[0] + 2;
    local_60.magnitude = local_60.magnitude + 1;
    local_60.normalized = 0;
    pcStack_1a0 = (code *)0x11137c;
    secp256k1_fe_verify(r_00);
    local_188._88_8_ = CONCAT44(local_60.normalized,local_60.magnitude);
    t = (secp256k1_fe *)(local_188 + 0x30);
    local_188._80_8_ = local_60.n[4];
    local_188._64_8_ = local_60.n[2];
    local_188._72_8_ = local_60.n[3];
    local_188._48_8_ = local_60.n[0];
    local_188._56_8_ = local_60.n[1];
    pcStack_1a0 = (code *)0x1113a6;
    secp256k1_fe_verify(t);
    psVar50 = (secp256k1_fe *)(local_188 + 0x90);
    pcStack_1a0 = (code *)0x1113b6;
    secp256k1_fe_verify(psVar50);
    if (iStack_d0 + local_188._88_4_ < 0x21) {
      local_188._48_8_ = local_188._48_8_ + local_188._144_8_;
      local_188._56_8_ = local_188._56_8_ + uStack_f0;
      local_188._64_8_ = local_188._64_8_ + local_e8;
      local_188._72_8_ = local_188._72_8_ + uStack_e0;
      local_188._80_8_ = local_188._80_8_ + local_d8;
      local_188._92_4_ = 0;
      local_188._88_4_ = iStack_d0 + local_188._88_4_;
      pcStack_1a0 = (code *)0x111415;
      secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
      pcStack_1a0 = (code *)0x11141d;
      secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
      uVar11 = ((ulong)local_188._80_8_ >> 0x30) * 0x1000003d1 + local_188._48_8_;
      if (((uVar11 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar11 & 0xfffffffffffff) == 0)) {
        uVar24 = (uVar11 >> 0x34) + local_188._56_8_;
        uVar35 = (uVar24 >> 0x34) + local_188._64_8_;
        uVar43 = (uVar35 >> 0x34) + local_188._72_8_;
        in_R8 = (uVar43 >> 0x34) + (local_188._80_8_ & 0xffffffffffff);
        if ((((uVar24 | uVar11 | uVar35 | uVar43) & 0xfffffffffffff) == 0 && in_R8 == 0) ||
           (in_R8 = in_R8 ^ 0xf000000000000,
           ((uVar11 | 0x1000003d0) & uVar24 & uVar35 & uVar43 & in_R8) == 0xfffffffffffff)) {
          pcStack_1a0 = (code *)0x11195a;
          secp256k1_ellswift_xswiftec_frac_var_cold_1();
        }
      }
      t = &local_90;
      pcStack_1a0 = (code *)0x1114ec;
      secp256k1_fe_mul(t,(secp256k1_fe *)(local_188 + 0x90),(secp256k1_fe *)local_188);
      pcStack_1a0 = (code *)0x1114f4;
      secp256k1_fe_verify(t);
      if (10 < local_90.magnitude) goto LAB_001118d2;
      local_90.magnitude = local_90.magnitude * 3;
      t = &local_90;
      local_90.n[0] = local_90.n[0] * 3;
      local_90.n[1] = local_90.n[1] * 3;
      local_90.n[2] = local_90.n[2] * 3;
      local_90.n[3] = local_90.n[3] * 3;
      local_90.n[4] = local_90.n[4] * 3;
      local_90.normalized = 0;
      pcStack_1a0 = (code *)0x11155a;
      secp256k1_fe_verify(t);
      psVar50 = (secp256k1_fe *)local_188;
      pcStack_1a0 = (code *)0x11156c;
      secp256k1_fe_sqr(psVar50,(secp256k1_fe *)(local_188 + 0x30));
      pcStack_1a0 = (code *)0x111574;
      secp256k1_fe_verify(psVar50);
      pcStack_1a0 = (code *)0x111581;
      secp256k1_fe_verify_magnitude(psVar50,1);
      local_188._0_8_ = 0x3ffffbfffff0bc - local_188._0_8_;
      local_188._8_8_ = 0x3ffffffffffffc - local_188._8_8_;
      local_188._16_8_ = 0x3ffffffffffffc - local_188._16_8_;
      local_188._24_8_ = 0x3ffffffffffffc - local_188._24_8_;
      local_188._32_8_ = 0x3fffffffffffc - local_188._32_8_;
      local_188._40_4_ = 2;
      local_188._44_4_ = 0;
      pcStack_1a0 = (code *)0x1115d0;
      secp256k1_fe_verify(psVar50);
      r_00 = (secp256k1_fe *)(local_188 + 0x60);
      pcStack_1a0 = (code *)0x1115e8;
      secp256k1_fe_mul(r_00,t,&local_c8);
      pcStack_1a0 = (code *)0x1115f0;
      secp256k1_fe_verify(r_00);
      pcStack_1a0 = (code *)0x1115f8;
      secp256k1_fe_verify(psVar50);
      if ((int)(local_188._40_4_ + local_188._136_4_) < 0x21) goto code_r0x0011160a;
    }
    else {
      pcStack_1a0 = (code *)0x1118d2;
      secp256k1_ellswift_xswiftec_frac_var_cold_7();
LAB_001118d2:
      pcStack_1a0 = (code *)0x1118d7;
      secp256k1_ellswift_xswiftec_frac_var_cold_6();
    }
    pcStack_1a0 = (code *)0x1118dc;
    secp256k1_ellswift_xswiftec_frac_var_cold_5();
LAB_001118dc:
    local_c8.n[4] = 0;
    local_c8.magnitude = 1;
    local_c8.normalized = 1;
    local_c8.n[2] = 0;
    local_c8.n[3] = 0;
    local_c8.n[0] = 1;
    local_c8.n[1] = 0;
  } while( true );
code_r0x00112c31:
  puVar38 = puVar38 + 1;
  uStack_1e60 = uStack_1e60 + 0x68;
  if (puVar38 == (undefined1 *)0xd) goto code_r0x00112c44;
  goto LAB_00112ac6;
code_r0x00112c44:
  lVar12 = 0;
  do {
    lVar32 = 0;
    do {
      bVar55 = true;
      if ((ulong)num_cores != 1) {
        psStack_1e30 = (secp256k1_gej *)((long)psStack_1e30[-0x2a150f76858d35].y.n + 0x23);
        bVar55 = (uint32_t)
                 (((ulong)psStack_1e30 >> 0x20 ^ (ulong)psStack_1e30 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar55) {
        auStack_1e00._0_4_ = (int)lVar12;
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e00);
        psVar14 = (secp256k1_ge *)(auStack_1090 + lVar32 * 0x68);
        psVar45 = asStack_1810;
        secp256k1_ecmult_const((secp256k1_gej *)psVar45,psVar14,(secp256k1_scalar *)auStack_1e00);
        uVar31 = (int)lVar32 * (int)lVar12;
        psVar40 = (secp256k1_ge *)
                  (auStack_1090 + (ulong)(uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc)) * 0x68);
        iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar45,psVar40);
        if (iVar7 == 0) goto LAB_00114ab1;
        if (lVar32 != 0 && lVar12 != 0) {
          psVar16 = (secp256k1_context *)auStack_1cb0;
          psVar45 = psVar16;
          iVar7 = secp256k1_ecmult_const_xonly
                            ((secp256k1_fe *)psVar16,(secp256k1_fe *)psVar14,(secp256k1_fe *)0x0,
                             (secp256k1_scalar *)auStack_1e00,0);
          if (iVar7 == 0) goto LAB_00114ab6;
          iVar7 = secp256k1_fe_equal((secp256k1_fe *)psVar16,(secp256k1_fe *)psVar40);
          if (iVar7 == 0) goto LAB_00114abb;
          do {
            psVar16 = (secp256k1_context *)auStack_1b10;
            testutil_random_fe((secp256k1_fe *)psVar16);
            secp256k1_fe_verify((secp256k1_fe *)psVar16);
            if (iStack_1ae4 == 0) {
              main_cold_53();
              goto LAB_00114a70;
            }
          } while ((SUB168(auStack_1b00 | auStack_1b10,8) == 0 &&
                   SUB168(auStack_1b00 | auStack_1b10,0) == 0) &&
                   CONCAT44(auStack_1aec,auStack_1af0) == 0);
          secp256k1_fe_mul((secp256k1_fe *)auStack_1390,(secp256k1_fe *)auStack_1b10,
                           (secp256k1_fe *)psVar14);
          psVar45 = (secp256k1_context *)auStack_1cb0;
          na = (secp256k1_scratch *)0x0;
          psVar16 = psVar45;
          iVar7 = secp256k1_ecmult_const_xonly
                            ((secp256k1_fe *)psVar45,(secp256k1_fe *)auStack_1390,
                             (secp256k1_fe *)auStack_1b10,(secp256k1_scalar *)auStack_1e00,0);
          if (iVar7 == 0) goto LAB_00114ac0;
          iVar7 = secp256k1_fe_equal((secp256k1_fe *)psVar45,(secp256k1_fe *)psVar40);
          if (iVar7 == 0) goto LAB_00114ac5;
        }
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 != 0xd);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xd);
  psVar17 = (secp256k1_scratch *)malloc(0x1020);
  if (psVar17 == (secp256k1_scratch *)0x0) {
    (*(psStack_1e50->error_callback).fn)("Out of memory",(psStack_1e50->error_callback).data);
  }
  else {
    psVar17->magic[0] = '\0';
    psVar17->magic[1] = '\0';
    psVar17->magic[2] = '\0';
    psVar17->magic[3] = '\0';
    psVar17->magic[4] = '\0';
    psVar17->magic[5] = '\0';
    psVar17->magic[6] = '\0';
    psVar17->magic[7] = '\0';
    psVar17->data = (void *)0x0;
    psVar17->alloc_size = 0;
    psVar17->max_size = 0;
    builtin_memcpy(psVar17->magic,"scratch",8);
    psVar17->data = psVar17 + 1;
    psVar17->max_size = 0x1000;
  }
  auStack_1d90._56_8_ = auStack_1d90._56_8_ + 0xb0;
  auStack_1d90._72_8_ = 0;
  uStack_1cf8 = 0;
  psStack_1cd8 = psVar17;
  do {
    auStack_1d90._88_8_ = 0;
    do {
      auStack_1d90._80_8_ = 0;
      do {
        uStack_1d08 = 0;
        do {
          uVar11 = (ulong)num_cores;
          bVar55 = true;
          if (uVar11 != 1) {
            uStack_1cf8 = uStack_1cf8 + 0xe7037ed1a0b428db;
            bVar55 = (uint32_t)((uStack_1cf8 >> 0x20 ^ uStack_1cf8 & 0xffffffff) * uVar11 >> 0x20)
                     == this_core;
          }
          if (bVar55) {
            puStack_1ce8 = (uint64_t *)(auStack_1090 + uStack_1d08 * 0x68);
            p_Stack_1cf0 = (_func_void_char_ptr_void_ptr *)
                           (uStack_1d08 * auStack_1d90._72_8_ + auStack_1d90._80_8_);
            p_Var30 = (_func_void_char_ptr_void_ptr *)0x0;
            do {
              asStack_1810[0].ecmult_gen_ctx.built = (int)auStack_1d90._72_8_;
              secp256k1_scalar_verify((secp256k1_scalar *)asStack_1810);
              asStack_1810[0].ecmult_gen_ctx.scalar_offset = (int)auStack_1d90._88_8_;
              secp256k1_scalar_verify(&asStack_1810[0].ecmult_gen_ctx.scalar_offset);
              auStack_1d90._0_4_ = (int)auStack_1d90._80_8_;
              secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d90);
              puVar39 = puStack_1ce8;
              psVar14 = &asStack_1810[0].ecmult_gen_ctx.ge_offset;
              for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
                (psVar14->x).n[0] = *puVar39;
                puVar39 = puVar39 + (ulong)bVar56 * -2 + 1;
                psVar14 = (secp256k1_ge *)((long)psVar14 + ((ulong)bVar56 * -2 + 1) * 8);
              }
              p_Stack_1ce0 = p_Var30;
              puVar39 = (uint64_t *)(auStack_1090 + (long)p_Var30 * 0x68);
              psVar50 = &asStack_1810[0].ecmult_gen_ctx.proj_blind;
              for (pvVar22 = (void *)0xd; pvVar22 != (void *)0x0;
                  pvVar22 = (void *)((long)pvVar22 + -1)) {
                psVar50->n[0] = *puVar39;
                puVar39 = puVar39 + (ulong)bVar56 * -2 + 1;
                psVar50 = (secp256k1_fe *)((long)psVar50 + ((ulong)bVar56 * -2 + 1) * 8);
              }
              secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1b10);
              if (psVar17 == (secp256k1_scratch *)0x0) {
LAB_001130d1:
                secp256k1_ecmult_multi_simple_var
                          ((secp256k1_gej *)auStack_1b10,(secp256k1_scalar *)auStack_1d90,
                           (secp256k1_ecmult_multi_callback *)asStack_1810,pvVar22,(size_t)na);
              }
              else {
                sVar18 = secp256k1_scratch_max_allocation
                                   ((secp256k1_callback *)auStack_1d90._56_8_,psVar17,6);
                pvVar22 = (void *)0x1;
                na = (secp256k1_scratch *)&DAT_001227c8;
                uVar11 = 0;
                do {
                  if (pvVar22 == (void *)0xd) break;
                  if (pvVar22 < (void *)0xd) {
                    uVar24 = *(ulong *)na->magic;
                  }
                  else {
                    uVar24 = 0;
                  }
                  bVar55 = false;
                  uVar35 = 0x7f / (ulong)((int)pvVar22 + 1);
                  uVar43 = (0x98L << ((byte)pvVar22 & 0x3f)) + uVar35 * 8 + 0x118;
                  if (uVar43 <= sVar18) {
                    uVar35 = (sVar18 - uVar43) / (uVar35 * 8 + 0x108);
                    bVar55 = uVar24 <= uVar35;
                    if (!bVar55) {
                      uVar24 = uVar35;
                    }
                    if (uVar11 < uVar24) {
                      uVar11 = uVar24;
                    }
                  }
                  na = (secp256k1_scratch *)&na->data;
                  pvVar22 = (void *)((long)pvVar22 + 1);
                } while (bVar55);
                if (uVar11 == 0) goto LAB_001130d1;
                sVar18 = secp256k1_scratch_max_allocation
                                   ((secp256k1_callback *)auStack_1d90._56_8_,psVar17,5);
                pvVar22 = (void *)(sVar18 - 0xe18);
                bVar55 = pvVar22 < (void *)0xfffffffffffff8f4;
                if (sVar18 < 0x70c) {
                  bVar55 = uVar11 != 1;
                }
                uVar11 = (ulong)bVar55 + 1;
                if (sVar18 < 0x70c) goto LAB_001130d1;
                uStack_1cb8 = (ulong)(pvVar22 < (void *)0xfffffffffffff8f4);
                uStack_1e68 = 2;
                puStack_1cc0 = (undefined1 *)(2 - uStack_1cb8);
                puVar38 = (undefined1 *)0x0;
                uStack_1cd0 = uVar11;
                do {
                  uVar24 = uVar11;
                  if (uStack_1e68 < uVar11) {
                    uVar24 = uStack_1e68;
                  }
                  lVar12 = (long)puVar38 << ((byte)uStack_1cb8 & 0x3f);
                  auStack_1d90._64_8_ = auStack_1d90;
                  if (puVar38 != (undefined1 *)0x0) {
                    auStack_1d90._64_8_ = (secp256k1_scalar *)0x0;
                  }
                  psVar28 = (secp256k1_gej *)0x0;
                  psVar37 = (secp256k1_scalar *)auStack_1d90._64_8_;
                  do {
                    psVar25 = (secp256k1_scalar *)((ulong)psVar37 & 0xffffffff);
                    bVar3 = psVar17->magic[(long)(psVar28->x).n];
                    bVar4 = *(byte *)((long)psVar28[0x1e78].y.n + 0x1c);
                    psVar37 = (secp256k1_scalar *)(ulong)((uint)bVar3 - (uint)bVar4);
                    if (bVar3 == bVar4) {
                      psVar37 = psVar25;
                    }
                    iVar7 = (int)psVar37;
                    if (bVar3 != bVar4) goto LAB_001131e5;
                    psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + 1);
                  } while (psVar28 != (secp256k1_gej *)0x8);
                  iVar7 = 0;
LAB_001131e5:
                  if (iVar7 == 0) {
                    puStack_1e38 = (undefined1 *)psVar17->alloc_size;
                  }
                  else {
                    (*(psStack_1e50->error_callback).fn)
                              ("invalid scratch space",(psStack_1e50->error_callback).data);
                    puStack_1e38 = (undefined1 *)0x0;
                  }
                  puStack_1e40 = puVar38;
                  secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1390);
                  uVar2 = auStack_1d90._56_8_;
                  if (uStack_1e68 == 0 && puVar38 != (undefined1 *)0x0) {
                    cVar49 = '\0';
                  }
                  else {
                    psStack_1e30 = (secp256k1_gej *)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)auStack_1d90._56_8_,psVar17,
                                              uVar24 * 0x98);
                    psStack_1cc8 = (secp256k1_scratch *)
                                   secp256k1_scratch_alloc
                                             ((secp256k1_callback *)uVar2,psVar17,uVar24 * 4);
                    pvVar22 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar2,psVar17,uVar24 * 0xc0);
                    auStack_1e00._0_8_ = pvVar22;
                    pvVar19 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar2,psVar17,uVar24 * 0x1a0);
                    auStack_1e00._8_8_ = pvVar19;
                    pvVar20 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)uVar2,psVar17,uVar24 * 0x410);
                    psVar17 = psStack_1cc8;
                    auStack_1df0._0_8_ = pvVar20;
                    auVar57._0_4_ =
                         -(uint)((int)psStack_1e30 == 0 && (int)((ulong)psStack_1e30 >> 0x20) == 0);
                    auVar57._4_4_ =
                         -(uint)((int)psStack_1cc8 == 0 && (int)((ulong)psStack_1cc8 >> 0x20) == 0);
                    auVar57._8_4_ = -(uint)((int)pvVar22 == 0 && (int)((ulong)pvVar22 >> 0x20) == 0)
                    ;
                    auVar57._12_4_ =
                         -(uint)((int)pvVar19 == 0 && (int)((ulong)pvVar19 >> 0x20) == 0);
                    iVar7 = movmskps((int)psVar28,auVar57);
                    psVar28 = (secp256k1_gej *)
                              CONCAT71((int7)(CONCAT44((int)((ulong)psVar28 >> 0x20),iVar7) >> 8),
                                       iVar7 != 0 || pvVar20 == (void *)0x0);
                    uStack_1cfc = (int)psVar28;
                    if (iVar7 == 0 && pvVar20 != (void *)0x0) {
                      if (uStack_1e68 != 0) {
                        psVar14 = &asStack_1810[0].ecmult_gen_ctx.ge_offset + lVar12;
                        sVar18 = 0;
                        psVar28 = psStack_1e30;
                        do {
                          *(undefined4 *)(psVar17->magic + sVar18 * 4) =
                               *(undefined4 *)
                                ((long)asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n +
                                sVar18 * 4 + lVar12 * 4 + -8);
                          psVar40 = psVar14;
                          psVar46 = (secp256k1_ge *)auStack_1cb0;
                          for (lVar32 = 0xd; lVar32 != 0; lVar32 = lVar32 + -1) {
                            (psVar46->x).n[0] = (psVar40->x).n[0];
                            psVar40 = (secp256k1_ge *)((long)psVar40 + ((ulong)bVar56 * -2 + 1) * 8)
                            ;
                            psVar46 = (secp256k1_ge *)((long)psVar46 + (ulong)bVar56 * -0x10 + 8);
                          }
                          secp256k1_gej_set_ge(psVar28,(secp256k1_ge *)auStack_1cb0);
                          sVar18 = sVar18 + 1;
                          psVar28 = psVar28 + 1;
                          psVar14 = psVar14 + 1;
                        } while (uVar24 != sVar18);
                      }
                      psVar28 = psStack_1e30;
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)auStack_1e00,
                                 (secp256k1_gej *)auStack_1390,uVar24,psStack_1e30,
                                 (secp256k1_scalar *)psVar17,(secp256k1_scalar *)auStack_1d90._64_8_
                                );
                      na = psVar17;
                    }
                    psVar17 = psStack_1cd8;
                    secp256k1_scratch_apply_checkpoint
                              ((secp256k1_callback *)auStack_1d90._56_8_,psStack_1cd8,
                               (size_t)puStack_1e38);
                    cVar49 = (char)uStack_1cfc;
                    uVar11 = uStack_1cd0;
                  }
                  puVar38 = puStack_1e40;
                  if (cVar49 == '\0') {
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)auStack_1b10,(secp256k1_gej *)auStack_1b10,
                               (secp256k1_gej *)auStack_1390,&psVar28->x);
                    uStack_1e68 = uStack_1e68 - uVar24;
                  }
                  puVar38 = puVar38 + 1;
                } while (cVar49 == '\0' && puVar38 != puStack_1cc0);
              }
              p_Var30 = p_Stack_1ce0;
              uVar31 = (int)p_Stack_1ce0 * auStack_1d90._88_4_ + (int)p_Stack_1cf0;
              psVar16 = (secp256k1_context *)auStack_1b10;
              uVar31 = secp256k1_gej_eq_ge_var
                                 ((secp256k1_gej *)psVar16,
                                  (secp256k1_ge *)
                                  (auStack_1090 +
                                  (ulong)(uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc)) * 0x68));
              uVar11 = (ulong)uVar31;
              if (uVar31 == 0) goto LAB_00114a98;
              p_Var30 = p_Var30 + 1;
            } while (p_Var30 != (_func_void_char_ptr_void_ptr *)0xd);
          }
          uStack_1d08 = uStack_1d08 + 1;
        } while (uStack_1d08 != 0xd);
        auStack_1d90._80_8_ = auStack_1d90._80_8_ + 1;
      } while (auStack_1d90._80_8_ != 0xd);
      auStack_1d90._88_8_ = auStack_1d90._88_8_ + 1;
    } while (auStack_1d90._88_8_ != 0xd);
    auStack_1d90._72_8_ = auStack_1d90._72_8_ + 1;
  } while (auStack_1d90._72_8_ != 0xd);
  if (psVar17 != (secp256k1_scratch *)0x0) {
    lVar12 = 0;
    do {
      bVar3 = psVar17->magic[lVar12];
      bVar4 = "scratch"[lVar12];
      psVar45 = (secp256k1_context *)(ulong)bVar4;
      uVar24 = (ulong)((uint)bVar3 - (uint)bVar4);
      if (bVar3 == bVar4) {
        uVar24 = uVar11;
      }
      iVar7 = (int)uVar24;
      if (bVar3 != bVar4) goto LAB_001134f6;
      lVar12 = lVar12 + 1;
      uVar11 = uVar24;
    } while (lVar12 != 8);
    iVar7 = 0;
LAB_001134f6:
    if (iVar7 == 0) {
      if (psVar17->alloc_size != 0) goto LAB_00114b06;
      psVar17->magic[0] = '\0';
      psVar17->magic[1] = '\0';
      psVar17->magic[2] = '\0';
      psVar17->magic[3] = '\0';
      psVar17->magic[4] = '\0';
      psVar17->magic[5] = '\0';
      psVar17->magic[6] = '\0';
      psVar17->magic[7] = '\0';
      free(psVar17);
      na = psVar17;
    }
    else {
      (*(psStack_1e50->error_callback).fn)
                ("invalid scratch space",(psStack_1e50->error_callback).data);
      na = psVar17;
    }
  }
  iVar7 = 1;
  pFStack_1e70 = (FILE *)0x0;
  do {
    iVar8 = 1;
    do {
      bVar55 = true;
      if ((ulong)num_cores != 1) {
        pFStack_1e70 = (FILE *)((long)pFStack_1e70 + 0xe7037ed1a0b428db);
        bVar55 = (uint32_t)
                 (((ulong)pFStack_1e70 >> 0x20 ^ (ulong)pFStack_1e70 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar55) {
        auStack_1cb0._0_4_ = 1;
        iVar26 = 1;
        do {
          auStack_1d90._0_4_ = iVar7;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d90);
          auStack_1e00._0_4_ = iVar8;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e00);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e00);
          auStack_1390 = (undefined1  [16])0x0;
          auStack_1380._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1380[0xf] = (char)iVar8;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d90);
          auStack_1b10 = (undefined1  [16])0x0;
          auStack_1b00._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1b00[0xf] = (char)iVar7;
          psVar45 = psStack_1e50;
          iVar9 = secp256k1_ecdsa_sign
                            (psStack_1e50,(secp256k1_ecdsa_signature *)asStack_1810,auStack_1b10,
                             auStack_1390,secp256k1_nonce_function_smallint,auStack_1cb0);
          if (iVar9 != 1) goto LAB_00114af2;
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1dc0,(uchar *)asStack_1810,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1d30,
                     (uchar *)(asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n + 3),(int *)0x0);
          psVar45 = (secp256k1_context *)auStack_1e20;
          r_from_k((secp256k1_scalar *)psVar45,(secp256k1_ge *)auStack_1090,auStack_1cb0._0_4_,
                   (int *)0x0);
          if (auStack_1dc0._0_4_ != auStack_1e20._0_4_) goto LAB_00114af7;
          uVar5 = auStack_1cb0._0_4_;
          uVar34 = auStack_1d30._0_4_ * auStack_1cb0._0_4_;
          uVar31 = auStack_1dc0._0_4_ * iVar8 + iVar7;
          na = (secp256k1_scratch *)(ulong)((uVar31 / 0xd) * 3);
          iVar9 = uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc);
          if (uVar34 - (uVar34 / 0xd + (uVar34 / 0xd) * 0xc) != iVar9) {
            uVar31 = (0xd - auStack_1d30._0_4_) * auStack_1cb0._0_4_;
            psVar45 = (secp256k1_context *)(ulong)((uVar31 / 0xd) * 3);
            if (uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc) != iVar9) goto LAB_00114afc;
          }
          if ((int)auStack_1cb0._0_4_ < iVar26) break;
          iVar26 = auStack_1cb0._0_4_ + 1;
          auStack_1cb0._0_4_ = iVar26;
        } while ((int)uVar5 < 0xc);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0xd);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0xd);
  uStack_1e68._0_4_ = 1;
  uStack_1e60 = 0;
  do {
    iVar7 = 1;
    do {
      iVar8 = 1;
      do {
        puVar38 = (undefined1 *)0x1;
        do {
          bVar55 = true;
          if ((ulong)num_cores != 1) {
            uStack_1e60 = uStack_1e60 + 0xe7037ed1a0b428db;
            bVar55 = (uint32_t)
                     ((uStack_1e60 >> 0x20 ^ uStack_1e60 & 0xffffffff) * (ulong)num_cores >> 0x20)
                     == this_core;
          }
          if (bVar55) {
            auStack_1d30._0_4_ = (uint)uStack_1e68;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d30);
            auStack_1dc0._0_4_ = iVar7;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1dc0);
            auStack_1d90._0_4_ = iVar8;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d90);
            auStack_1e00._0_4_ = (int)puVar38;
            puStack_1e40 = puVar38;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e00);
            uVar31 = 0;
            iVar26 = 0;
            do {
              r_from_k((secp256k1_scalar *)asStack_1810,(secp256k1_ge *)auStack_1090,iVar26,
                       (int *)0x0);
              if (iVar7 == asStack_1810[0].ecmult_gen_ctx.built) {
                auStack_1e20._0_4_ = iVar26;
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e20);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1e20,(secp256k1_scalar *)auStack_1e20,
                           (secp256k1_scalar *)auStack_1d30);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1e54,(secp256k1_scalar *)auStack_1dc0,
                           (secp256k1_scalar *)auStack_1e00);
                secp256k1_scalar_add
                          ((secp256k1_scalar *)auStack_1e54,(secp256k1_scalar *)auStack_1e54,
                           (secp256k1_scalar *)auStack_1d90);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e20);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e54);
                uVar31 = uVar31 | (uchar  [4])auStack_1e20._0_4_ == auStack_1e54;
              }
              iVar26 = iVar26 + 1;
            } while (iVar26 != 0xd);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d30);
            secp256k1_ecdsa_signature_save
                      ((secp256k1_ecdsa_signature *)auStack_1390,(secp256k1_scalar *)auStack_1dc0,
                       (secp256k1_scalar *)auStack_1d30);
            puVar38 = puStack_1e40;
            puVar41 = (undefined8 *)(auStack_1090 + (long)puStack_1e40 * 0x68);
            psVar45 = asStack_1810;
            for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
              uVar2 = *puVar41;
              (psVar45->ecmult_gen_ctx).built = (int)uVar2;
              (psVar45->ecmult_gen_ctx).scalar_offset = (int)((ulong)uVar2 >> 0x20);
              puVar41 = puVar41 + (ulong)bVar56 * -2 + 1;
              psVar45 = (secp256k1_context *)((long)psVar45 + (ulong)bVar56 * -0x10 + 8);
            }
            secp256k1_pubkey_save((secp256k1_pubkey *)auStack_1b10,(secp256k1_ge *)asStack_1810);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d90);
            auStack_1cb0 = (undefined1  [16])0x0;
            auStack_1ca0._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1ca0[0xf] = (char)iVar8;
            psVar45 = psStack_1e50;
            uVar34 = secp256k1_ecdsa_verify
                               (psStack_1e50,(secp256k1_ecdsa_signature *)auStack_1390,auStack_1cb0,
                                (secp256k1_pubkey *)auStack_1b10);
            if (((uint)uStack_1e68 < 7 & uVar31) != uVar34) goto LAB_00114b01;
          }
          puVar38 = puVar38 + 1;
        } while (puVar38 != (undefined1 *)0xd);
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0xd);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0xd);
    uStack_1e68._0_4_ = (uint)uStack_1e68 + 1;
  } while ((uint)uStack_1e68 != 0xd);
  iVar7 = 1;
  uStack_1e60 = 0;
  do {
    iVar8 = 1;
    do {
      bVar55 = true;
      if ((ulong)num_cores != 1) {
        uStack_1e60 = uStack_1e60 + 0xe7037ed1a0b428db;
        bVar55 = (uint32_t)
                 ((uStack_1e60 >> 0x20 ^ uStack_1e60 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar55) {
        auStack_1d90._0_4_ = 1;
        iVar26 = 1;
        do {
          auStack_1d30._0_4_ = iVar7;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d30);
          auStack_1dc0._0_4_ = iVar8;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1dc0);
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1dc0);
          auStack_1cb0 = (undefined1  [16])0x0;
          auStack_1ca0._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1ca0[0xf] = (char)iVar8;
          secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d30);
          auStack_1e00 = (undefined1  [16])0x0;
          auStack_1df0._0_15_ = SUB1615((undefined1  [16])0x0,0);
          auStack_1df0[0xf] = (char)iVar7;
          secp256k1_ecdsa_sign_recoverable
                    (psStack_1e50,(secp256k1_ecdsa_recoverable_signature *)asStack_1810,auStack_1e00
                     ,auStack_1cb0,secp256k1_nonce_function_smallint,auStack_1d90);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1e20,(uchar *)asStack_1810,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1e54,
                     (uchar *)(asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n + 3),(int *)0x0);
          bVar3 = (byte)asStack_1810[0].ecmult_gen_ctx.ge_offset.y.n[1];
          psVar45 = (secp256k1_context *)auStack_1e44;
          r_from_k((secp256k1_scalar *)psVar45,(secp256k1_ge *)auStack_1090,auStack_1d90._0_4_,
                   (int *)&sStack_1e24);
          auVar27 = auStack_1e54;
          if ((undefined1  [4])auStack_1e20._0_4_ != auStack_1e44) goto LAB_00114b0b;
          lVar12 = (long)(int)auStack_1d90._0_4_;
          uVar31 = (int)auStack_1e54 * auStack_1d90._0_4_;
          uVar34 = auStack_1e20._0_4_ * iVar8 + iVar7;
          iVar9 = uVar34 - (uVar34 / 0xd + (uVar34 / 0xd) * 0xc);
          if ((uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc) != iVar9) &&
             (uVar31 = (0xd - (int)auStack_1e54) * auStack_1d90._0_4_,
             uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc) != iVar9)) goto LAB_00114b10;
          uVar31 = (uint)(sStack_1e24 != 0) * 2;
          lVar32 = lVar12 * 0x68;
          auStack_1af0 = *(uchar (*) [4])(auStack_1040 + lVar32);
          auStack_1aec = *(uchar (*) [4])(auStack_103c + lVar32);
          iStack_1ae8 = aiStack_1038[lVar12 * 0x1a];
          iStack_1ae4 = aiStack_1038[lVar12 * 0x1a + 1];
          auStack_1b10._8_8_ = asStack_1058[lVar12 * 0xd];
          auStack_1b10._0_8_ = *(undefined8 *)(auStack_1060 + lVar32);
          auStack_1b00._8_8_ = *(undefined8 *)(auStack_1040 + lVar32 + -8);
          auStack_1b00._0_8_ = asStack_1058[lVar12 * 0xd + 1];
          psVar45 = (secp256k1_context *)auStack_1b10;
          secp256k1_fe_normalize((secp256k1_fe *)psVar45);
          uVar34 = (int)auVar27 * auStack_1d90._0_4_;
          secp256k1_fe_verify((secp256k1_fe *)psVar45);
          if (uVar34 - (uVar34 / 0xd + (uVar34 / 0xd) * 0xc) == iVar9) {
            if (iStack_1ae4 == 0) goto LAB_00114b15;
            uVar31 = auStack_1b10._0_4_ & 1 | uVar31;
          }
          else {
            if (iStack_1ae4 == 0) goto LAB_00114b1a;
            uVar31 = (auStack_1b10._0_4_ & 1 | uVar31) ^ 1;
          }
          if (uVar31 != bVar3) goto LAB_00114b1f;
          secp256k1_ecdsa_recoverable_signature_convert
                    (psStack_1e50,(secp256k1_ecdsa_signature *)auStack_1390,
                     (secp256k1_ecdsa_recoverable_signature *)asStack_1810);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1e20,(uchar *)auStack_1390,(int *)0x0);
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)auStack_1e54,(uchar *)&uStack_1370,(int *)0x0);
          psVar45 = (secp256k1_context *)auStack_1e44;
          r_from_k((secp256k1_scalar *)psVar45,(secp256k1_ge *)auStack_1090,auStack_1d90._0_4_,
                   (int *)0x0);
          if ((undefined1  [4])auStack_1e20._0_4_ != auStack_1e44) goto LAB_00114b24;
          uVar5 = auStack_1d90._0_4_;
          uVar34 = (int)auStack_1e54 * auStack_1d90._0_4_;
          uVar31 = auStack_1e20._0_4_ * iVar8 + iVar7;
          na = (secp256k1_scratch *)(ulong)((uVar31 / 0xd) * 3);
          iVar9 = uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc);
          if (uVar34 - (uVar34 / 0xd + (uVar34 / 0xd) * 0xc) != iVar9) {
            uVar31 = (0xd - (int)auStack_1e54) * auStack_1d90._0_4_;
            psVar45 = (secp256k1_context *)(ulong)((uVar31 / 0xd) * 3);
            if (uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc) != iVar9) goto LAB_00114b29;
          }
          if ((int)auStack_1d90._0_4_ < iVar26) break;
          iVar26 = auStack_1d90._0_4_ + 1;
          auStack_1d90._0_4_ = iVar26;
        } while ((int)uVar5 < 0xc);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0xd);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0xd);
  pFStack_1e70._0_4_ = 1;
  uStack_1e68 = 0;
  do {
    iVar7 = 1;
    do {
      iVar8 = 1;
      do {
        lVar12 = 1;
        do {
          bVar55 = true;
          if ((ulong)num_cores != 1) {
            uStack_1e68 = uStack_1e68 + 0xe7037ed1a0b428db;
            bVar55 = (uint32_t)
                     ((uStack_1e68 >> 0x20 ^ uStack_1e68 & 0xffffffff) * (ulong)num_cores >> 0x20)
                     == this_core;
          }
          if (bVar55) {
            auStack_1e20._0_4_ = (uint)pFStack_1e70;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e20);
            auStack_1d30._0_4_ = iVar7;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d30);
            auStack_1dc0._0_4_ = iVar8;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1dc0);
            auStack_1d90._0_4_ = (int)lVar12;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d90);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1dc0);
            auStack_1e00 = (undefined1  [16])0x0;
            auStack_1df0._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1df0[0xf] = (char)iVar8;
            uVar31 = 0;
            auVar27[0] = '\0';
            auVar27[1] = '\0';
            auVar27[2] = '\0';
            auVar27[3] = '\0';
            do {
              r_from_k((secp256k1_scalar *)asStack_1810,(secp256k1_ge *)auStack_1090,(int)auVar27,
                       (int *)0x0);
              if (iVar7 == asStack_1810[0].ecmult_gen_ctx.built) {
                auStack_1e54 = auVar27;
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e54);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1e54,(secp256k1_scalar *)auStack_1e54,
                           (secp256k1_scalar *)auStack_1e20);
                secp256k1_scalar_mul
                          ((secp256k1_scalar *)auStack_1e44,(secp256k1_scalar *)auStack_1d30,
                           (secp256k1_scalar *)auStack_1d90);
                secp256k1_scalar_add
                          ((secp256k1_scalar *)auStack_1e44,(secp256k1_scalar *)auStack_1e44,
                           (secp256k1_scalar *)auStack_1dc0);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e54);
                secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e44);
                uVar31 = uVar31 | auStack_1e54 == (uchar  [4])auStack_1e44;
              }
              auVar27 = (uchar  [4])((int)auVar27 + 1);
            } while (auVar27 != (uchar  [4])0xd);
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e20);
            secp256k1_ecdsa_recoverable_signature_save
                      ((secp256k1_ecdsa_recoverable_signature *)auStack_1390,
                       (secp256k1_scalar *)auStack_1d30,(secp256k1_scalar *)auStack_1e20,0);
            psVar45 = psStack_1e50;
            secp256k1_ecdsa_recoverable_signature_convert
                      (psStack_1e50,(secp256k1_ecdsa_signature *)auStack_1b10,
                       (secp256k1_ecdsa_recoverable_signature *)auStack_1390);
            puVar41 = (undefined8 *)(auStack_1090 + lVar12 * 0x68);
            psVar16 = asStack_1810;
            for (lVar32 = 0xd; lVar32 != 0; lVar32 = lVar32 + -1) {
              uVar2 = *puVar41;
              (psVar16->ecmult_gen_ctx).built = (int)uVar2;
              (psVar16->ecmult_gen_ctx).scalar_offset = (int)((ulong)uVar2 >> 0x20);
              puVar41 = puVar41 + (ulong)bVar56 * -2 + 1;
              psVar16 = (secp256k1_context *)((long)psVar16 + (ulong)bVar56 * -0x10 + 8);
            }
            secp256k1_pubkey_save((secp256k1_pubkey *)auStack_1cb0,(secp256k1_ge *)asStack_1810);
            uVar34 = secp256k1_ecdsa_verify
                               (psVar45,(secp256k1_ecdsa_signature *)auStack_1b10,auStack_1e00,
                                (secp256k1_pubkey *)auStack_1cb0);
            if (((uint)pFStack_1e70 < 7 & uVar31) != uVar34) goto LAB_00114b2e;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0xd);
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0xd);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0xd);
    pFStack_1e70._0_4_ = (uint)pFStack_1e70 + 1;
  } while ((uint)pFStack_1e70 != 0xd);
  pFStack_1e70 = (FILE *)0x1;
  puVar38 = auStack_1b50;
  puVar33 = auStack_1cb0;
  do {
    auStack_1d30._0_4_ = (int)pFStack_1e70;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d30);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d30);
    auStack_1dc0 = (undefined1  [16])0x0;
    auStack_1db0._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1db0[0xf] = (char)pFStack_1e70;
    lVar12 = (long)pFStack_1e70 - 1;
    keypair = (secp256k1_keypair *)
              ((long)(&asStack_1810[0].ecmult_gen_ctx.ge_offset + -1) + (long)pFStack_1e70 * 0x60);
    psVar45 = psStack_1e50;
    iVar7 = secp256k1_keypair_create(psStack_1e50,keypair,auStack_1dc0);
    if (iVar7 == 0) goto LAB_00114b33;
    psVar45 = psStack_1e50;
    iVar7 = secp256k1_ec_pubkey_create
                      (psStack_1e50,(secp256k1_pubkey *)(auStack_1390 + lVar12 * 0x40),auStack_1dc0)
    ;
    if (iVar7 == 0) goto LAB_00114b38;
    psVar54 = (secp256k1_xonly_pubkey *)(auStack_1b10 + lVar12 * 0x40);
    pk_parity = (uchar (*) [4])(auStack_1e00 + lVar12 * 4);
    psVar45 = psStack_1e50;
    iVar7 = secp256k1_keypair_xonly_pub(psStack_1e50,psVar54,(int *)pk_parity,keypair);
    if (iVar7 == 0) goto LAB_00114b3d;
    puVar53 = auStack_1cb0 + lVar12 * 0x20;
    psVar45 = psStack_1e50;
    iVar7 = secp256k1_xonly_pubkey_serialize(psStack_1e50,puVar53,psVar54);
    if (iVar7 == 0) goto LAB_00114b42;
    psVar45 = psStack_1e50;
    iVar7 = secp256k1_xonly_pubkey_parse(psStack_1e50,psVar54,puVar53);
    if (iVar7 == 0) goto LAB_00114b47;
    psVar45 = psStack_1e50;
    iVar7 = secp256k1_xonly_pubkey_serialize(psStack_1e50,auStack_1dc0,psVar54);
    if (iVar7 == 0) goto LAB_00114b4c;
    lVar32 = 0;
    do {
      bVar3 = auStack_1dc0[lVar32];
      psVar45 = (secp256k1_context *)(ulong)bVar3;
      iVar7 = (uint)(byte)puVar33[lVar32] - (uint)bVar3;
      if (puVar33[lVar32] != bVar3) goto LAB_00114123;
      lVar32 = lVar32 + 1;
    } while (lVar32 != 0x20);
    iVar7 = 0;
LAB_00114123:
    if (iVar7 != 0) goto LAB_00114b51;
    psVar45 = psStack_1e50;
    iVar7 = secp256k1_xonly_pubkey_from_pubkey
                      (psStack_1e50,psVar54,(int *)auStack_1e20,
                       (secp256k1_pubkey *)(auStack_1390 + lVar12 * 0x40));
    if (iVar7 == 0) goto LAB_00114b56;
    if ((uchar  [4])auStack_1e20._0_4_ != *pk_parity) goto LAB_00114b5b;
    psVar45 = psStack_1e50;
    iVar7 = secp256k1_xonly_pubkey_serialize(psStack_1e50,auStack_1dc0,psVar54);
    if (iVar7 == 0) goto LAB_00114b60;
    lVar12 = 0;
    do {
      bVar3 = auStack_1dc0[lVar12];
      psVar45 = (secp256k1_context *)(ulong)bVar3;
      iVar7 = (uint)(byte)puVar33[lVar12] - (uint)bVar3;
      if (puVar33[lVar12] != bVar3) goto LAB_0011419e;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x20);
    iVar7 = 0;
LAB_0011419e:
    if (iVar7 != 0) goto LAB_00114b65;
    psVar45 = (secp256k1_context *)auStack_1d90;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar45,puVar53);
    auStack_1d90._40_8_ = (void *)0x1;
    secp256k1_fe_verify((secp256k1_fe *)psVar45);
    lVar12 = (long)pFStack_1e70 * 0x68;
    iVar7 = secp256k1_fe_equal((secp256k1_fe *)psVar45,(secp256k1_fe *)(auStack_1090 + lVar12));
    if (iVar7 == 0) goto LAB_00114b6a;
    auStack_1d90._0_8_ = *(uchar (*) [8])(auStack_1060 + lVar12);
    auStack_1d90._8_8_ = asStack_1058[(long)pFStack_1e70 * 0xd];
    auStack_1d90._16_8_ = asStack_1058[(long)pFStack_1e70 * 0xd + 1];
    auStack_1d90._24_8_ = *(undefined8 *)(auStack_1040 + lVar12 + -8);
    auStack_1d90._32_4_ = *(undefined4 *)(auStack_1040 + lVar12);
    auStack_1d90._36_4_ = *(undefined4 *)(auStack_103c + lVar12);
    auStack_1d90._44_4_ = aiStack_1038[(long)pFStack_1e70 * 0x1a + 1];
    auStack_1d90._40_4_ = aiStack_1038[(long)pFStack_1e70 * 0x1a];
    psVar45 = (secp256k1_context *)auStack_1d90;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar45);
    secp256k1_fe_verify((secp256k1_fe *)psVar45);
    if (auStack_1d90._44_4_ == 0) goto LAB_00114b6f;
    if ((uchar  [4])(auStack_1d90._0_4_ & 1) != *pk_parity) goto LAB_00114b74;
    if (6 < pFStack_1e70) {
      lVar12 = 0;
      psVar16 = extraout_RDX;
      do {
        psVar45 = (secp256k1_context *)((ulong)psVar16 & 0xffffffff);
        bVar3 = puVar33[lVar12];
        na = (secp256k1_scratch *)(ulong)bVar3;
        bVar4 = puVar38[lVar12];
        psVar16 = (secp256k1_context *)(ulong)((uint)bVar3 - (uint)bVar4);
        if (bVar3 == bVar4) {
          psVar16 = psVar45;
        }
        iVar7 = (int)psVar16;
        if (bVar3 != bVar4) goto LAB_0011428f;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x20);
      iVar7 = 0;
LAB_0011428f:
      if (iVar7 != 0) goto LAB_00114b79;
      if (*pk_parity != (uchar  [4])(1U - *(int *)(auStack_1e00 + (0xc - (long)pFStack_1e70) * 4)))
      goto LAB_00114b7e;
    }
    pFStack_1e70 = (FILE *)((long)pFStack_1e70 + 1);
    puVar33 = puVar33 + 0x20;
    puVar38 = puVar38 + -0x20;
  } while (pFStack_1e70 != (FILE *)0xd);
  lVar12 = 0;
  do {
    psVar45 = psStack_1e50;
    iVar7 = secp256k1_xonly_pubkey_parse
                      (psStack_1e50,(secp256k1_xonly_pubkey *)asStack_1810,
                       invalid_pubkey_bytes[0] + lVar12);
    if (iVar7 != 0) goto LAB_00114b83;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0xe0);
  iVar7 = 1;
  psVar16 = asStack_1810;
  psVar54 = (secp256k1_xonly_pubkey *)auStack_1390;
  puVar53 = auStack_1b10;
  lVar12 = 0;
  do {
    auStack_1e00._0_4_ = iVar7;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e00);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e00);
    auStack_1cb0 = (undefined1  [16])0x0;
    auStack_1ca0._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1ca0[0xf] = (char)iVar7;
    psVar45 = psStack_1e50;
    iVar8 = secp256k1_keypair_create(psStack_1e50,(secp256k1_keypair *)psVar16,auStack_1cb0);
    if (iVar8 == 0) goto LAB_00114b88;
    psVar45 = psStack_1e50;
    iVar8 = secp256k1_keypair_xonly_pub
                      (psStack_1e50,psVar54,(int *)(auStack_1d90 + lVar12),
                       (secp256k1_keypair *)psVar16);
    if (iVar8 == 0) goto LAB_00114b8d;
    psVar45 = psStack_1e50;
    iVar8 = secp256k1_xonly_pubkey_serialize(psStack_1e50,puVar53,psVar54);
    if (iVar8 == 0) goto LAB_00114b92;
    lVar12 = lVar12 + 4;
    puVar53 = puVar53 + 0x20;
    psVar54 = psVar54 + 1;
    psVar16 = (secp256k1_context *)&(psVar16->ecmult_gen_ctx).ge_offset.y.magnitude;
    iVar7 = iVar7 + 1;
  } while (lVar12 != 0x30);
  auStack_1e20._16_8_ = (uchar *)0x0;
  auStack_1e20._0_8_ = 0x8cb36fda;
  auStack_1e20._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  uStack_1e60 = 1;
  uStack_1e68 = 0;
  do {
    iVar7 = 0xd - (int)uStack_1e60;
    if ((&iStack_1d94)[uStack_1e60] == 0) {
      iVar7 = (int)uStack_1e60;
    }
    auStack_1e54[0] = '\x01';
    auStack_1e54[1] = '\0';
    auStack_1e54[2] = '\0';
    auStack_1e54[3] = '\0';
    do {
      auStack_1de0 = (undefined1  [16])0x0;
      auStack_1df0 = (undefined1  [16])0x0;
      auStack_1e00 = (undefined1  [16])0x0;
      uStack_1dd0 = 0;
      bVar55 = true;
      if ((ulong)num_cores != 1) {
        uStack_1e68 = uStack_1e68 + 0xe7037ed1a0b428db;
        bVar55 = (uint32_t)
                 ((uStack_1e68 >> 0x20 ^ uStack_1e68 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar55) {
        auStack_1e20._8_8_ = secp256k1_hardened_nonce_function_smallint;
        auStack_1e20._16_8_ = auStack_1e54;
        auVar27 = (uchar  [4])(0xd - (int)auStack_1e54);
        if ((&iStack_1d94)[(int)auStack_1e54] == 0) {
          auVar27 = auStack_1e54;
        }
        iVar8 = 0;
        do {
          testrand256(auStack_1dc0);
          na = (secp256k1_scratch *)(auStack_1b10 + (uStack_1e60 + -1) * 0x20);
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)auStack_1e44,abStack_1b30 + (long)(int)auStack_1e54 * 0x20,
                     auStack_1dc0,0x20,(uchar *)(auStack_1b10 + (uStack_1e60 + -1) * 0x20));
          uVar11 = (ulong)(uint)auStack_1e44;
          if (*(int *)(auStack_1e00 + uVar11 * 4) == 0) {
            uVar31 = (int)auStack_1e44 * iVar7 + (int)auVar27;
            sVar51 = uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc);
            sStack_1e24 = sVar51;
            secp256k1_scalar_verify(&sStack_1e24);
            auStack_1d30 = (undefined1  [16])0x0;
            auStack_1d20._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1d20[0xf] = (char)sVar51;
            psVar45 = psStack_1e50;
            iVar26 = secp256k1_schnorrsig_sign_custom
                               (psStack_1e50,auStack_1cb0,auStack_1dc0,0x20,
                                (secp256k1_keypair *)
                                ((long)(&asStack_1810[0].ecmult_gen_ctx.ge_offset + -1) +
                                uStack_1e60 * 0x60),(secp256k1_schnorrsig_extraparams *)auStack_1e20
                               );
            if (iVar26 == 0) goto LAB_00114b97;
            pbVar23 = abStack_1b30;
            pbVar21 = pbVar23 + (long)(int)auStack_1e54 * 0x20;
            lVar12 = 0;
            do {
              pbVar42 = (byte *)((ulong)pbVar23 & 0xffffffff);
              bVar3 = auStack_1cb0[lVar12];
              psVar45 = (secp256k1_context *)(ulong)bVar3;
              bVar4 = pbVar21[lVar12];
              na = (secp256k1_scratch *)(ulong)bVar4;
              pbVar23 = (byte *)(ulong)((uint)bVar3 - (uint)bVar4);
              if (bVar3 == bVar4) {
                pbVar23 = pbVar42;
              }
              iVar26 = (int)pbVar23;
              if (bVar3 != bVar4) goto LAB_001145da;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0x20);
            iVar26 = 0;
LAB_001145da:
            if (iVar26 != 0) goto LAB_00114b9c;
            lVar12 = 0;
            do {
              pbVar23 = (byte *)((ulong)pbVar21 & 0xffffffff);
              bVar3 = auStack_1c90[lVar12];
              bVar4 = auStack_1d30[lVar12];
              psVar45 = (secp256k1_context *)(ulong)bVar4;
              pbVar21 = (byte *)(ulong)((uint)bVar3 - (uint)bVar4);
              if (bVar3 == bVar4) {
                pbVar21 = pbVar23;
              }
              iVar26 = (int)pbVar21;
              if (bVar3 != bVar4) goto LAB_0011460d;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 0x20);
            iVar26 = 0;
LAB_0011460d:
            if (iVar26 != 0) goto LAB_00114ba1;
            *(undefined4 *)(auStack_1e00 + uVar11 * 4) = 1;
            iVar8 = iVar8 + 1;
          }
        } while (iVar8 < 0xd);
      }
      auVar27 = (uchar  [4])((int)auStack_1e54 + 1);
      bVar55 = (int)auStack_1e54 < 0xc;
      auStack_1e54 = auVar27;
    } while (bVar55);
    uStack_1e60 = uStack_1e60 + 1;
  } while (uStack_1e60 != 0xd);
  puStack_1e40 = (undefined1 *)0x1;
  puStack_1e38 = (undefined1 *)0x0;
  do {
    puVar38 = puStack_1e40 + -1;
    lVar12 = (long)puVar38 * 0x20;
    auStack_1db0 = *(undefined1 (*) [16])(auStack_1b00 + lVar12);
    iVar7 = 0xd - (int)puStack_1e40;
    if ((&iStack_1d94)[(long)puStack_1e40] == 0) {
      iVar7 = (int)puStack_1e40;
    }
    psStack_1e30 = (secp256k1_gej *)CONCAT44(psStack_1e30._4_4_,iVar7);
    auStack_1dc0._8_8_ = *(undefined8 *)(auStack_1b10 + lVar12 + 8);
    auStack_1dc0._0_8_ = *(undefined8 *)(auStack_1b10 + lVar12);
    uStack_1e60 = 1;
    do {
      uVar2 = auStack_1d90._64_8_;
      auStack_1de0 = (undefined1  [16])0x0;
      auStack_1df0 = (undefined1  [16])0x0;
      auStack_1e00 = (undefined1  [16])0x0;
      uStack_1dd0 = 0;
      bVar55 = true;
      if ((ulong)num_cores != 1) {
        puStack_1e38 = puStack_1e38 + -0x18fc812e5f4bd725;
        bVar55 = (uint32_t)
                 (((ulong)puStack_1e38 >> 0x20 ^ (ulong)puStack_1e38 & 0xffffffff) *
                  (ulong)num_cores >> 0x20) == this_core;
      }
      if (bVar55) {
        iVar7 = (int)uStack_1e60;
        if (uStack_1e60 < 7) {
          lVar12 = (uStack_1e60 - 1) * 0x20;
          auStack_1ca0 = *(undefined1 (*) [16])(auStack_1b00 + lVar12);
          auStack_1cb0._8_8_ = *(undefined8 *)(auStack_1b10 + lVar12 + 8);
          auStack_1cb0._0_8_ = *(undefined8 *)(auStack_1b10 + lVar12);
          iVar8 = 0xd - iVar7;
          if ((&iStack_1d94)[uStack_1e60] == 0) {
            iVar8 = iVar7;
          }
        }
        else {
          auStack_1cb0 = *(undefined1 (*) [16])invalid_pubkey_bytes[iVar7 - 7U];
          auStack_1ca0 = *(undefined1 (*) [16])(invalid_pubkey_bytes[iVar7 - 7U] + 0x10);
          iVar8 = -1;
        }
        auStack_1d90._65_3_ = 0;
        auStack_1d90[0x40] = iVar8 != -1;
        auStack_1d90._68_4_ = SUB84(uVar2,4);
        iVar7 = 0;
        do {
          testrand256(auStack_1d30);
          na = (secp256k1_scratch *)auStack_1dc0;
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)auStack_1e20,auStack_1cb0,auStack_1d30,0x20,(uchar *)na);
          uVar11 = auStack_1e20._0_8_ & 0xffffffff;
          if (*(int *)(auStack_1e00 + uVar11 * 4) == 0) {
            uVar31 = (int)auStack_1e20._0_8_ * (int)psStack_1e30 + iVar8;
            iVar9 = 0;
            iVar26 = 0;
            do {
              if (iVar9 == 0xe) {
                testrand256(auStack_1c90);
                uVar34 = 0;
              }
              else {
                auStack_1c90 = (undefined1  [16])0x0;
                auStack_1c80._0_12_ = SUB1612((undefined1  [16])0x0,0);
                auStack_1c80._12_4_ = 0;
                uVar34 = 0;
                if (iVar9 != 0xd && iVar8 != -1) {
                  uVar34 = (uint)(uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc) == iVar9);
                }
              }
              psVar45 = psStack_1e50;
              na = (secp256k1_scratch *)(auStack_1390 + (long)puVar38 * 0x40);
              uVar10 = secp256k1_schnorrsig_verify
                                 (psStack_1e50,auStack_1cb0,auStack_1d30,0x20,
                                  (secp256k1_xonly_pubkey *)(auStack_1390 + (long)puVar38 * 0x40));
              if (uVar10 != uVar34) goto LAB_00114ba6;
              iVar26 = iVar26 + uVar10;
              iVar9 = iVar9 + 1;
            } while (iVar9 != 0xf);
            if (iVar26 != auStack_1d90._64_4_) goto LAB_00114bab;
            *(undefined4 *)(auStack_1e00 + uVar11 * 4) = 1;
            iVar7 = iVar7 + 1;
          }
        } while (iVar7 < 0xd);
      }
      uStack_1e60 = uStack_1e60 + 1;
    } while (uStack_1e60 != 0xe);
    puStack_1e40 = puStack_1e40 + 1;
  } while (puStack_1e40 != (undefined1 *)0x7);
  lVar12 = 0x68;
  iVar7 = 1;
  do {
    auStack_1e00._0_4_ = iVar7;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e00);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1e00);
    auStack_1cb0 = (undefined1  [16])0x0;
    auStack_1ca0._0_15_ = SUB1615((undefined1  [16])0x0,0);
    auStack_1ca0[0xf] = (char)iVar7;
    psVar45 = psStack_1e50;
    iVar8 = secp256k1_ellswift_create(psStack_1e50,auStack_1390,auStack_1cb0,(uchar *)0x0);
    psVar16 = psStack_1e50;
    if (iVar8 == 0) goto LAB_00114bb0;
    secp256k1_ellswift_decode(psStack_1e50,(secp256k1_pubkey *)auStack_1b10,auStack_1390);
    psVar45 = asStack_1810;
    secp256k1_pubkey_load(psVar16,(secp256k1_ge *)psVar45,(secp256k1_pubkey *)auStack_1b10);
    iVar8 = secp256k1_ge_eq_var((secp256k1_ge *)psVar45,(secp256k1_ge *)(auStack_1090 + lVar12));
    if (iVar8 == 0) goto LAB_00114bb5;
    lVar12 = lVar12 + 0x68;
    iVar7 = iVar7 + 1;
  } while (lVar12 != 0x548);
  secp256k1_context_destroy(psStack_1e50);
  iVar7 = count;
  goto joined_r0x0011246c;
LAB_00114a70:
  main_cold_4();
LAB_00114a75:
  main_cold_5();
LAB_00114a7a:
  main_cold_6();
LAB_00114a7f:
  main_cold_69();
LAB_00114a84:
  main_cold_68();
LAB_00114a89:
  main_cold_67();
LAB_00114a8e:
  main_cold_7();
LAB_00114a93:
  main_cold_8();
LAB_00114a98:
  main_cold_50();
LAB_00114a9d:
  psVar45 = psVar16;
  main_cold_61();
LAB_00114aa2:
  main_cold_60();
LAB_00114aa7:
  main_cold_59();
LAB_00114aac:
  main_cold_58();
LAB_00114ab1:
  main_cold_56();
LAB_00114ab6:
  psVar16 = psVar45;
  main_cold_55();
LAB_00114abb:
  main_cold_54();
LAB_00114ac0:
  psVar45 = psVar16;
  main_cold_52();
LAB_00114ac5:
  main_cold_51();
LAB_00114aca:
  main_cold_71();
LAB_00114acf:
  main_cold_3();
LAB_00114ad4:
  main_cold_70();
LAB_00114ad9:
  main_cold_66();
LAB_00114ade:
  main_cold_65();
  goto LAB_00114ae3;
code_r0x0011160a:
  local_188._96_8_ = local_188._96_8_ + local_188._0_8_;
  local_188._104_8_ = local_188._104_8_ + local_188._8_8_;
  local_188._112_8_ = local_188._112_8_ + local_188._16_8_;
  local_188._120_8_ = local_188._120_8_ + local_188._24_8_;
  local_188._128_8_ = (long)((secp256k1_fe *)local_188._32_8_)->n + local_188._128_8_;
  local_188._140_4_ = 0;
  pcStack_1a0 = (code *)0x11164e;
  psVar15 = (secp256k1_gej *)local_188._32_8_;
  local_188._136_4_ = local_188._40_4_ + local_188._136_4_;
  secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x60));
  pcStack_1a0 = (code *)0x11165e;
  iVar7 = secp256k1_ge_x_frac_on_curve_var((secp256k1_fe *)(local_188 + 0x60),&local_90);
  if (iVar7 != 0) {
    (local_190->x).n[4] = local_188._128_8_;
    (local_190->x).magnitude = local_188._136_4_;
    (local_190->x).normalized = local_188._140_4_;
    (local_190->x).n[2] = local_188._112_8_;
    (local_190->x).n[3] = local_188._120_8_;
    (local_190->x).n[0] = local_188._96_8_;
    (local_190->x).n[1] = local_188._104_8_;
    xd->n[4] = local_90.n[4];
    xd->magnitude = local_90.magnitude;
    xd->normalized = local_90.normalized;
    xd->n[2] = local_90.n[2];
    xd->n[3] = local_90.n[3];
    xd->n[0] = local_90.n[0];
    xd->n[1] = local_90.n[1];
    return;
  }
  auVar1._8_8_ = local_188._72_8_;
  auVar1._0_8_ = local_188._64_8_;
  *(undefined4 *)(xd->n + 4) = local_188._80_4_;
  *(undefined4 *)((long)xd->n + 0x24) = local_188._84_4_;
  xd->magnitude = local_188._88_4_;
  xd->normalized = local_188._92_4_;
  *(undefined1 (*) [16])(xd->n + 2) = auVar1;
  xd->n[0] = local_188._48_8_;
  xd->n[1] = local_188._56_8_;
  psVar29 = (secp256k1_gej *)local_188;
  pcStack_1a0 = (code *)0x1116ef;
  secp256k1_fe_mul((secp256k1_fe *)psVar29,&secp256k1_ellswift_c1,(secp256k1_fe *)(local_188 + 0x90)
                  );
  psVar36 = &secp256k1_ellswift_c2;
  pcStack_1a0 = (code *)0x11170b;
  secp256k1_fe_mul((secp256k1_fe *)(local_188 + 0x60),&secp256k1_ellswift_c2,&local_60);
  pcStack_1a0 = (code *)0x111713;
  secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x60));
  pcStack_1a0 = (code *)0x11171b;
  secp256k1_fe_verify((secp256k1_fe *)psVar29);
  if ((int)(local_188._40_4_ + local_188._136_4_) < 0x21) {
    psVar36 = (secp256k1_fe *)(local_188 + 0x60);
    local_188._96_8_ = local_188._96_8_ + local_188._0_8_;
    local_188._104_8_ = local_188._104_8_ + local_188._8_8_;
    local_188._112_8_ = local_188._112_8_ + local_188._16_8_;
    local_188._120_8_ = local_188._120_8_ + local_188._24_8_;
    local_188._128_8_ = (long)((secp256k1_fe *)local_188._32_8_)->n + local_188._128_8_;
    local_188._140_4_ = 0;
    pcStack_1a0 = (code *)0x111770;
    psVar15 = (secp256k1_gej *)local_188._32_8_;
    local_188._136_4_ = local_188._40_4_ + local_188._136_4_;
    secp256k1_fe_verify(psVar36);
    pcStack_1a0 = (code *)0x111783;
    secp256k1_fe_mul(psVar36,psVar36,&local_c8);
    pcStack_1a0 = (code *)0x111790;
    iVar7 = secp256k1_ge_x_frac_on_curve_var(psVar36,(secp256k1_fe *)(local_188 + 0x30));
    if (iVar7 != 0) {
      (local_190->x).n[4] = local_188._128_8_;
      (local_190->x).magnitude = local_188._136_4_;
      (local_190->x).normalized = local_188._140_4_;
      (local_190->x).n[2] = local_188._112_8_;
      (local_190->x).n[3] = local_188._120_8_;
      (local_190->x).n[0] = local_188._96_8_;
      (local_190->x).n[1] = local_188._104_8_;
      return;
    }
    psVar29 = (secp256k1_gej *)local_188;
    psVar36 = (secp256k1_fe *)(local_188 + 0x30);
    pcStack_1a0 = (code *)0x1117dc;
    secp256k1_fe_mul((secp256k1_fe *)psVar29,psVar36,&local_c8);
    pcStack_1a0 = (code *)0x1117e9;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x60));
    pcStack_1a0 = (code *)0x1117f1;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    if (0x20 < (int)(local_188._40_4_ + local_188._136_4_)) goto LAB_00111964;
    a_00 = (secp256k1_fe *)(local_188 + 0x60);
    local_188._96_8_ = local_188._96_8_ + local_188._0_8_;
    local_188._104_8_ = local_188._104_8_ + local_188._8_8_;
    local_188._112_8_ = local_188._112_8_ + local_188._16_8_;
    local_188._120_8_ = local_188._120_8_ + local_188._24_8_;
    local_188._128_8_ = (long)((secp256k1_fe *)local_188._32_8_)->n + local_188._128_8_;
    local_188._140_4_ = 0;
    pcStack_1a0 = (code *)0x111846;
    psVar15 = (secp256k1_gej *)local_188._32_8_;
    local_188._136_4_ = local_188._40_4_ + local_188._136_4_;
    secp256k1_fe_verify(a_00);
    pcStack_1a0 = (code *)0x11184e;
    secp256k1_fe_verify(a_00);
    pcStack_1a0 = (code *)0x11185b;
    secp256k1_fe_verify_magnitude(a_00,2);
    psVar28 = local_190;
    (local_190->x).n[0] = 0x5ffff9ffffe91a - local_188._96_8_;
    (local_190->x).n[1] = 0x5ffffffffffffa - local_188._104_8_;
    (local_190->x).n[2] = 0x5ffffffffffffa - local_188._112_8_;
    (local_190->x).n[3] = 0x5ffffffffffffa - local_188._120_8_;
    (local_190->x).n[4] = 0x5fffffffffffa - local_188._128_8_;
    (local_190->x).magnitude = 3;
    (local_190->x).normalized = 0;
    pcStack_1a0 = (code *)0x1118a6;
    secp256k1_fe_verify(&local_190->x);
    psVar36 = (secp256k1_fe *)(local_188 + 0x30);
    pcStack_1a0 = (code *)0x1118b3;
    psVar29 = psVar28;
    iVar7 = secp256k1_ge_x_frac_on_curve_var(&psVar28->x,psVar36);
    if (iVar7 != 0) {
      return;
    }
  }
  else {
    pcStack_1a0 = (code *)0x111964;
    secp256k1_ellswift_xswiftec_frac_var_cold_4();
LAB_00111964:
    a_00 = (secp256k1_fe *)local_188;
    pcStack_1a0 = (code *)0x111969;
    secp256k1_ellswift_xswiftec_frac_var_cold_3();
  }
  pcStack_1a0 = secp256k1_ecmult_const_xonly;
  secp256k1_ellswift_xswiftec_frac_var_cold_2();
  pcStack_1a0 = (code *)0xfffffffffffff;
  r_01 = (secp256k1_gej *)auStack_330;
  psStack_348 = (secp256k1_gej *)0x11199b;
  psStack_1c8 = psVar28;
  psStack_1c0 = psVar50;
  psStack_1b8 = r_00;
  psStack_1b0 = a_00;
  puStack_1a8 = local_188 + 0x60;
  secp256k1_fe_sqr((secp256k1_fe *)r_01,psVar36);
  psStack_348 = (secp256k1_gej *)0x1119a9;
  secp256k1_fe_mul((secp256k1_fe *)r_01,(secp256k1_fe *)r_01,psVar36);
  psStack_338 = psVar29;
  if (a == (secp256k1_fe *)0x0) {
    psStack_348 = (secp256k1_gej *)0x111b61;
    secp256k1_fe_verify((secp256k1_fe *)auStack_330);
    auStack_330._0_8_ = auStack_330._0_8_ + 2;
    iStack_308 = iStack_308 + 1;
    iStack_304 = 0;
    psStack_348 = (secp256k1_gej *)0x111b77;
    secp256k1_fe_verify((secp256k1_fe *)auStack_330);
    if ((int)in_R8 == 0) {
      psVar14 = (secp256k1_ge *)auStack_330;
LAB_00111b80:
      psStack_348 = (secp256k1_gej *)0x111b85;
      iVar7 = secp256k1_fe_is_square_var(&psVar14->x);
      if (iVar7 == 0) {
        return;
      }
    }
LAB_00111b8d:
    psVar29 = (secp256k1_gej *)auStack_330;
    psStack_348 = (secp256k1_gej *)0x111ba5;
    secp256k1_fe_mul(&sStack_230.x,(secp256k1_fe *)psVar29,psVar36);
    psVar36 = &sStack_230.y;
    psStack_348 = (secp256k1_gej *)0x111bb8;
    secp256k1_fe_sqr(psVar36,(secp256k1_fe *)psVar29);
    sStack_230.infinity = 0;
    psStack_348 = (secp256k1_gej *)0x111bc9;
    psVar28 = psVar15;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar15);
    if ((int)(psVar15->x).n[0] == 0) {
      psStack_348 = (secp256k1_gej *)0x111c78;
      secp256k1_ecmult_const_xonly_cold_5();
    }
    else {
      psVar29 = (secp256k1_gej *)auStack_2d0;
      psStack_348 = (secp256k1_gej *)0x111beb;
      secp256k1_ecmult_const(psVar29,&sStack_230,(secp256k1_scalar *)psVar15);
      psStack_348 = (secp256k1_gej *)0x111bf3;
      psVar28 = psVar29;
      secp256k1_gej_verify(psVar29);
      if (iStack_240 == 0) {
        psStack_348 = (secp256k1_gej *)0x111c11;
        secp256k1_fe_sqr(&sStack_300,&sStack_270);
        psStack_348 = (secp256k1_gej *)0x111c21;
        secp256k1_fe_mul(&sStack_300,&sStack_300,(secp256k1_fe *)auStack_330);
        if (a != (secp256k1_fe *)0x0) {
          psStack_348 = (secp256k1_gej *)0x111c36;
          secp256k1_fe_mul(&sStack_300,&sStack_300,a);
        }
        psStack_348 = (secp256k1_gej *)0x111c46;
        secp256k1_fe_inv(&sStack_300,&sStack_300);
        psStack_348 = (secp256k1_gej *)0x111c58;
        secp256k1_fe_mul(&psStack_338->x,(secp256k1_fe *)auStack_2d0,&sStack_300);
        return;
      }
    }
    psStack_348 = (secp256k1_gej *)0x111c7d;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_00111c7d:
    psStack_348 = (secp256k1_gej *)0x111c82;
    secp256k1_ecmult_const_xonly_cold_1();
LAB_00111c82:
    psStack_348 = (secp256k1_gej *)0x111c87;
    secp256k1_ecmult_const_xonly_cold_3();
  }
  else {
    psStack_348 = (secp256k1_gej *)0x1119bf;
    secp256k1_fe_verify(a);
    uVar11 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
    uVar24 = (uVar11 >> 0x34) + a->n[1];
    uVar35 = (uVar24 >> 0x34) + a->n[2];
    psVar28 = (secp256k1_gej *)((uVar35 >> 0x34) + a->n[3]);
    uVar43 = ((ulong)psVar28 >> 0x34) + (a->n[4] & 0xffffffffffff);
    if ((((uVar24 | uVar11 | uVar35 | (ulong)psVar28) & 0xfffffffffffff) == 0 && uVar43 == 0) ||
       (((uVar11 ^ 0x1000003d0) & uVar24 & uVar35 & (ulong)psVar28 & (uVar43 ^ 0xf000000000000)) ==
        0xfffffffffffff)) goto LAB_00111c7d;
    r_01 = (secp256k1_gej *)auStack_2d0;
    psStack_348 = (secp256k1_gej *)0x111a6b;
    secp256k1_fe_sqr((secp256k1_fe *)r_01,a);
    psStack_348 = (secp256k1_gej *)0x111a73;
    psVar28 = r_01;
    secp256k1_fe_verify((secp256k1_fe *)r_01);
    if (0x10 < iStack_2a8) goto LAB_00111c82;
    r_01 = (secp256k1_gej *)auStack_2d0;
    auStack_2d0._0_8_ = auStack_2d0._0_8_ * 2;
    auStack_2d0._8_8_ = auStack_2d0._8_8_ * 2;
    uStack_2b8 = uStack_2b8 * 2;
    auStack_2d0._16_8_ = auStack_2d0._16_8_ * 2;
    uStack_2b0 = uStack_2b0 << 1;
    iStack_2a8 = iStack_2a8 * 2;
    iStack_2a4 = 0;
    psStack_348 = (secp256k1_gej *)0x111abf;
    secp256k1_fe_verify((secp256k1_fe *)r_01);
    psStack_348 = (secp256k1_gej *)0x111acd;
    secp256k1_fe_mul((secp256k1_fe *)r_01,(secp256k1_fe *)r_01,a);
    psVar29 = (secp256k1_gej *)auStack_330;
    psStack_348 = (secp256k1_gej *)0x111ada;
    secp256k1_fe_verify((secp256k1_fe *)psVar29);
    psStack_348 = (secp256k1_gej *)0x111ae2;
    psVar28 = r_01;
    secp256k1_fe_verify((secp256k1_fe *)r_01);
    if (iStack_2a8 + iStack_308 < 0x21) {
      auStack_330._0_8_ = auStack_330._0_8_ + auStack_2d0._0_8_;
      auStack_330._8_8_ = auStack_330._8_8_ + auStack_2d0._8_8_;
      auStack_330._16_8_ = auStack_330._16_8_ + auStack_2d0._16_8_;
      uStack_318 = uStack_318 + uStack_2b8;
      uStack_310 = uStack_310 + uStack_2b0;
      iStack_304 = 0;
      psStack_348 = (secp256k1_gej *)0x111b33;
      iStack_308 = iStack_2a8 + iStack_308;
      secp256k1_fe_verify((secp256k1_fe *)auStack_330);
      if ((int)in_R8 == 0) {
        psVar14 = &sStack_230;
        psStack_348 = (secp256k1_gej *)0x111b4f;
        secp256k1_fe_mul(&psVar14->x,(secp256k1_fe *)auStack_330,a);
        goto LAB_00111b80;
      }
      goto LAB_00111b8d;
    }
  }
  psStack_348 = (secp256k1_gej *)secp256k1_fe_normalize;
  secp256k1_ecmult_const_xonly_cold_2();
  pcStack_360 = (code *)0x111cad;
  psStack_358 = psVar29;
  psStack_348 = psVar15;
  secp256k1_fe_verify(&psVar28->x);
  uVar11 = (psVar28->x).n[4];
  uVar24 = (uVar11 >> 0x30) * 0x1000003d1 + (psVar28->x).n[0];
  uVar43 = (uVar24 >> 0x34) + (psVar28->x).n[1];
  uVar35 = (uVar43 >> 0x34) + (psVar28->x).n[2];
  uVar44 = uVar35 & 0xfffffffffffff;
  uVar35 = (uVar35 >> 0x34) + (psVar28->x).n[3];
  uVar11 = (uVar35 >> 0x34) + (uVar11 & 0xffffffffffff);
  uVar24 = uVar24 & 0xfffffffffffff;
  uVar48 = (ulong)(0xffffefffffc2e < uVar24 &&
                  ((uVar44 & uVar43 & uVar35) == 0xfffffffffffff && uVar11 == 0xffffffffffff)) |
           uVar11 >> 0x30;
  uVar24 = uVar48 * 0x1000003d1 + uVar24;
  uVar43 = (uVar24 >> 0x34) + (uVar43 & 0xfffffffffffff);
  psVar37 = (secp256k1_scalar *)((uVar43 >> 0x34) + uVar44);
  uVar35 = ((ulong)psVar37 >> 0x34) + (uVar35 & 0xfffffffffffff);
  uVar11 = (uVar35 >> 0x34) + uVar11;
  if ((uint)(ushort)(uVar11 >> 0x30) == (uint)uVar48) {
    (psVar28->x).n[0] = uVar24 & 0xfffffffffffff;
    (psVar28->x).n[1] = uVar43 & 0xfffffffffffff;
    (psVar28->x).n[2] = (ulong)psVar37 & 0xfffffffffffff;
    (psVar28->x).n[3] = uVar35 & 0xfffffffffffff;
    (psVar28->x).n[4] = uVar11 & 0xffffffffffff;
    (psVar28->x).magnitude = 1;
    (psVar28->x).normalized = 1;
    secp256k1_fe_verify(&psVar28->x);
    return;
  }
  pcStack_360 = main;
  secp256k1_fe_normalize_cold_1();
  uStack_368 = 0xfffffffffffff;
  uStack_370 = 0xffffffffffff;
  psStack_388 = psVar28;
  psStack_380 = psVar36;
  psStack_378 = r_01;
  pcStack_360 = (code *)(in_R8 & 0xffffffff);
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  if (1 < (int)uVar35) {
    lVar12 = strtol(*(char **)(psVar37 + 2),(char **)0x0,0);
    count = (int)lVar12;
  }
  pcVar52 = (char *)0x0;
  printf("test count = %i\n",(ulong)(uint)count);
  if (2 < (int)uVar35) {
    pcVar52 = *(char **)(psVar37 + 4);
  }
  asStack_1810[0].ecmult_gen_ctx.built = 0;
  asStack_1810[0].ecmult_gen_ctx.scalar_offset = 0;
  asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
  pFStack_1e70 = (FILE *)(uVar35 & 0xffffffff);
  auStack_1d90._64_8_ = psVar37;
  if ((pcVar52 == (char *)0x0) || (*pcVar52 == '\0')) {
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) goto LAB_00114a33;
    sVar13 = fread(asStack_1810,1,0x10,__stream);
    if (sVar13 != 0x10) goto LAB_00114a33;
    goto LAB_00111f07;
  }
  iVar7 = 0;
  while ((((iVar7 < 0x10 && (*pcVar52 != '\0')) && (pcVar52[1] != '\0')) &&
         (iVar8 = __isoc99_sscanf(pcVar52,"%2hx",auStack_b40), iVar8 == 1))) {
    *(undefined1 *)((long)asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n + (long)iVar7 + -8) =
         auStack_b40[0];
    pcVar52 = pcVar52 + 2;
    iVar7 = iVar7 + 1;
  }
LAB_00111f14:
  na = (secp256k1_scratch *)((ulong)asStack_1810[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff);
  puStack_1e40 = (undefined1 *)((ulong)asStack_1810[0].ecmult_gen_ctx._0_8_ >> 0x38);
  puStack_1e38 = (undefined1 *)(asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff);
  psStack_1e30 = (secp256k1_gej *)(asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff);
  lVar12 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         asStack_1810[0].ecmult_gen_ctx._0_8_ & 0xff,
         (ulong)asStack_1810[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff);
  auStack_b40._0_8_ = 0xbb67ae856a09e667;
  auStack_b40._8_8_ = 0xa54ff53a3c6ef372;
  auStack_b40._16_8_ = 0x9b05688c510e527f;
  auStack_b40._24_8_ = 0x5be0cd191f83d9ab;
  auStack_b40._96_8_ = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_b40,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_b40,(uchar *)asStack_1810,0x10);
  puVar53 = auStack_1090;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_b40,puVar53);
  uVar2 = auStack_1d90._64_8_;
  do {
    psVar50 = (secp256k1_fe *)0x0;
    uVar11 = 0;
    do {
      uVar11 = (ulong)puVar53[(long)psVar50] | uVar11 << 8;
      psVar50 = (secp256k1_fe *)((long)psVar50->n + 1);
    } while (psVar50 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar12] = uVar11;
    lVar12 = lVar12 + 1;
    puVar53 = puVar53 + 8;
  } while (lVar12 != 4);
  if (4 < (int)(uint)pFStack_1e70) {
    lVar12 = strtol(*(char **)(auStack_1d90._64_8_ + 0x18),(char **)0x0,0);
    num_cores = (uint32_t)lVar12;
    uVar11 = strtol(*(char **)(uVar2 + 0x20),(char **)0x0,0);
    this_core = (uint32_t)uVar11;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00114a59:
      main_cold_2();
      return;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar11 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  psVar45 = (secp256k1_context *)0xd0;
  psVar14 = (secp256k1_ge *)malloc(0xd0);
  if (psVar14 != (secp256k1_ge *)0x0) {
    psVar45 = (secp256k1_context *)0x130;
    psVar28 = (secp256k1_gej *)malloc(0x130);
    if (psVar28 != (secp256k1_gej *)0x0) {
      psVar45 = (secp256k1_context *)0x130;
      psVar15 = (secp256k1_gej *)malloc(0x130);
      if (psVar15 != (secp256k1_gej *)0x0) {
        secp256k1_scalar_verify(&secp256k1_scalar_one);
        asStack_1810[0].ecmult_gen_ctx.built = 7;
        secp256k1_scalar_verify((secp256k1_scalar *)asStack_1810);
        secp256k1_gej_set_infinity((secp256k1_gej *)auStack_b40);
        uVar31 = 0xff;
        do {
          secp256k1_gej_double_var
                    ((secp256k1_gej *)auStack_b40,(secp256k1_gej *)auStack_b40,(secp256k1_fe *)0x0);
          secp256k1_scalar_verify((secp256k1_scalar *)asStack_1810);
          bVar55 = (7U >> (uVar31 & 0x1f) & 1) != 0;
          psVar50 = (secp256k1_fe *)CONCAT71((int7)((ulong)psVar50 >> 8),bVar55);
          if ((uVar31 < 0x20) && (bVar55)) {
            psVar50 = (secp256k1_fe *)0x0;
            secp256k1_gej_add_ge_var
                      ((secp256k1_gej *)auStack_b40,(secp256k1_gej *)auStack_b40,
                       &secp256k1_ge_const_g,(secp256k1_fe *)0x0);
          }
          bVar55 = uVar31 != 0;
          uVar31 = uVar31 - 1;
        } while (bVar55);
        psVar45 = (secp256k1_context *)auStack_1090;
        secp256k1_gej_double_var
                  ((secp256k1_gej *)psVar45,(secp256k1_gej *)auStack_b40,(secp256k1_fe *)0x0);
        iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar45,&secp256k1_ge_const_g);
        if (iVar7 != 0) {
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1090);
          lVar12 = -0x98;
          do {
            secp256k1_gej_add_var
                      ((secp256k1_gej *)auStack_1090,(secp256k1_gej *)auStack_1090,
                       (secp256k1_gej *)auStack_b40,psVar50);
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_b40,(secp256k1_gej *)auStack_b40,(secp256k1_fe *)0x0
                      );
            memcpy((void *)((long)psVar28[1].x.n + lVar12),(secp256k1_gej *)auStack_b40,0x98);
            if (lVar12 != 0) {
              secp256k1_gej_double_var
                        ((secp256k1_gej *)auStack_b40,(secp256k1_gej *)auStack_b40,
                         (secp256k1_fe *)0x0);
            }
            lVar12 = lVar12 + 0x98;
          } while (lVar12 == 0);
          secp256k1_gej_neg(psVar15,(secp256k1_gej *)auStack_1090);
          secp256k1_gej_add_var(psVar15 + 1,psVar15,psVar28,psVar50);
          lVar12 = 0;
          do {
            secp256k1_gej_verify((secp256k1_gej *)((long)(psVar15->x).n + lVar12));
            lVar12 = lVar12 + 0x98;
          } while (lVar12 == 0x98);
          psVar50 = &psVar15->z;
          lVar12 = -1;
          lVar32 = 0;
          psVar40 = psVar14;
          do {
            if ((int)psVar50[1].n[0] == 0) {
              if (lVar12 == -1) {
                uVar47 = psVar50->n[0];
                uVar6 = psVar50->n[1];
                auVar1 = *(undefined1 (*) [16])(psVar50->n + 2);
                uVar5 = *(undefined4 *)((long)psVar50->n + 0x24);
                iVar7 = psVar50->magnitude;
                iVar8 = psVar50->normalized;
                *(int *)((psVar40->x).n + 4) = (int)psVar50->n[4];
                *(undefined4 *)((long)(psVar40->x).n + 0x24) = uVar5;
                (psVar40->x).magnitude = iVar7;
                (psVar40->x).normalized = iVar8;
                *(undefined1 (*) [16])((psVar40->x).n + 2) = auVar1;
                (psVar40->x).n[0] = uVar47;
                (psVar40->x).n[1] = uVar6;
                lVar12 = lVar32;
              }
              else {
                secp256k1_fe_mul(&psVar40->x,&psVar14[lVar12].x,psVar50);
                lVar12 = lVar32;
              }
            }
            else {
              secp256k1_ge_set_infinity(psVar40);
            }
            lVar32 = lVar32 + 1;
            psVar40 = psVar40 + 1;
            psVar50 = (secp256k1_fe *)(psVar50[3].n + 1);
          } while (lVar32 == 1);
          if (lVar12 != -1) {
            psVar45 = (secp256k1_context *)auStack_1090;
            secp256k1_fe_inv_var((secp256k1_fe *)psVar45,&psVar14[lVar12].x);
            if ((lVar12 != 0) && (psVar15->infinity == 0)) {
              psVar45 = (secp256k1_context *)auStack_1090;
              secp256k1_fe_mul(&psVar14[lVar12].x,(secp256k1_fe *)psVar14,(secp256k1_fe *)psVar45);
              secp256k1_fe_mul((secp256k1_fe *)psVar45,(secp256k1_fe *)psVar45,&psVar15[lVar12].z);
              lVar12 = 0;
            }
            if (psVar15[lVar12].infinity != 0) goto LAB_00114acf;
            psVar50 = &psVar14[lVar12].x;
            *(undefined4 *)(psVar50->n + 4) = uStack_1070;
            *(undefined4 *)((long)psVar50->n + 0x24) = uStack_106c;
            *(int *)(psVar50->n + 4 + 1) = iStack_1068;
            psVar50->normalized = iStack_1064;
            *(undefined1 (*) [16])(psVar14[lVar12].x.n + 2) = auStack_1090._16_16_;
            psVar14[lVar12].x.n[0] = auStack_1090._0_8_;
            psVar14[lVar12].x.n[1] = auStack_1090._8_8_;
            lVar12 = 0;
            psVar29 = psVar15;
            do {
              if (psVar29->infinity == 0) {
                psVar40 = (secp256k1_ge *)((long)(psVar14->x).n + lVar12);
                secp256k1_ge_set_gej_zinv(psVar40,psVar29,(secp256k1_fe *)psVar40);
              }
              lVar12 = lVar12 + 0x68;
              psVar29 = psVar29 + 1;
            } while (lVar12 == 0x68);
            lVar12 = 0;
            do {
              secp256k1_ge_verify((secp256k1_ge *)((long)(psVar14->x).n + lVar12));
              lVar12 = lVar12 + 0x68;
            } while (lVar12 == 0x68);
          }
          r = secp256k1_ecmult_gen_prec_table;
          lVar12 = 0;
          do {
            psVar45 = (secp256k1_context *)((long)(psVar14->x).n + lVar12);
            psVar16 = psVar45;
            secp256k1_ge_verify((secp256k1_ge *)psVar45);
            if (*(int *)((long)(&psVar14->y + 1) + lVar12) != 0) goto LAB_00114a70;
            secp256k1_ge_to_storage(*r,(secp256k1_ge *)psVar45);
            lVar12 = lVar12 + 0x68;
            r = (secp256k1_ge_storage (*) [2])((long)r + 0x40);
          } while (lVar12 == 0x68);
          free(psVar15);
          free(psVar28);
          free(psVar14);
          secp256k1_gej_set_ge((secp256k1_gej *)auStack_b40,&secp256k1_ge_const_g);
          secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_b40,gen);
          iVar7 = 0x80;
          do {
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_b40,(secp256k1_gej *)auStack_b40,(secp256k1_fe *)0x0
                      );
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_b40,gen_00);
          iVar7 = count;
joined_r0x0011246c:
          count = iVar7 + -1;
          if (iVar7 == 0) {
            testrand256((uchar *)asStack_1810);
            printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n"
                   ,asStack_1810[0].ecmult_gen_ctx._0_8_ & 0xff,
                   (ulong)asStack_1810[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
                   (ulong)asStack_1810[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
                   (ulong)asStack_1810[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
                   (ulong)asStack_1810[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
                   (ulong)asStack_1810[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
                   (ulong)asStack_1810[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
                   (ulong)asStack_1810[0].ecmult_gen_ctx._0_8_ >> 0x38,
                   asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,
                   asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff,
                   asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
                   asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
                   asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
                   asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
                   asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
                   asStack_1810[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
            puts("no problems found");
            return;
          }
          psVar16 = secp256k1_context_create(1);
          testrand256(abStack_1b30);
          psVar45 = psVar16;
          iVar7 = secp256k1_context_randomize(psVar16,abStack_1b30);
          if (iVar7 == 0) goto LAB_00114ad4;
          psStack_1e50 = psVar16;
          auStack_1d90._56_8_ = psVar16;
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_b40);
          secp256k1_ge_set_gej((secp256k1_ge *)auStack_1090,(secp256k1_gej *)auStack_b40);
          iVar7 = 1;
          lVar12 = -0x4e0;
          psVar28 = (secp256k1_gej *)auStack_b40;
          do {
            psVar15 = psVar28 + 1;
            secp256k1_gej_add_ge(psVar15,psVar28,&secp256k1_ge_const_g);
            secp256k1_ge_set_gej((secp256k1_ge *)(auStack_b48 + lVar12),psVar15);
            if (count != 0) {
              testutil_random_fe((secp256k1_fe *)asStack_1810);
              secp256k1_gej_rescale(psVar15,(secp256k1_fe *)asStack_1810);
            }
            auStack_1b10._0_4_ = iVar7;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1b10);
            secp256k1_ecmult_gen
                      (&psStack_1e50->ecmult_gen_ctx,(secp256k1_gej *)asStack_1810,
                       (secp256k1_scalar *)auStack_1b10);
            psVar16 = (secp256k1_context *)auStack_1390;
            secp256k1_ge_set_gej((secp256k1_ge *)psVar16,(secp256k1_gej *)asStack_1810);
            if (*(int *)(auStack_b40 + lVar12 + 0x58) != 0) goto LAB_00114a75;
            if (iStack_1330 != 0) goto LAB_00114a7a;
            psVar16 = (secp256k1_context *)auStack_1390;
            iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar16,
                                       (secp256k1_fe *)(auStack_b48 + lVar12));
            if (iVar8 == 0) goto LAB_00114a7f;
            psVar16 = (secp256k1_context *)auStack_1360;
            iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar16,
                                       (secp256k1_fe *)(auStack_b40 + lVar12 + 0x28));
            if (iVar8 == 0) goto LAB_00114a84;
            iVar7 = iVar7 + 1;
            lVar12 = lVar12 + 0x68;
            psVar28 = psVar15;
          } while (lVar12 != 0);
          uVar11 = 0;
          puVar38 = auStack_1090;
          lVar12 = 0;
          do {
            psVar16 = (secp256k1_context *)(puVar38 + (uVar11 / 0xd) * -0x548);
            secp256k1_ge_mul_lambda
                      ((secp256k1_ge *)asStack_1810,(secp256k1_ge *)(auStack_1090 + lVar12));
            iVar7 = secp256k1_ge_eq_var((secp256k1_ge *)psVar16,(secp256k1_ge *)asStack_1810);
            if (iVar7 == 0) goto LAB_00114a89;
            lVar12 = lVar12 + 0x68;
            puVar38 = puVar38 + 0x3a8;
            uVar11 = uVar11 + 9;
          } while (lVar12 != 0x548);
          psVar45 = (secp256k1_context *)auStack_1090;
          secp256k1_ge_verify((secp256k1_ge *)psVar45);
          if (aiStack_1038[2] == 0) goto LAB_00114ad9;
          psVar45 = (secp256k1_context *)auStack_b40;
          secp256k1_gej_verify((secp256k1_gej *)psVar45);
          if (auStack_b40._144_4_ == 0) goto LAB_00114ade;
          lVar12 = 0xc;
          psVar45 = asStack_1028;
          a_01 = (secp256k1_context *)(auStack_b40 + 0x98);
          do {
            psVar16 = psVar45;
            secp256k1_ge_verify((secp256k1_ge *)psVar45);
            if ((psVar45->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00114a8e;
            psVar16 = a_01;
            secp256k1_gej_verify((secp256k1_gej *)a_01);
            if ((int)(a_01->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00114a93;
            a_01 = (secp256k1_context *)&(a_01->ecmult_gen_ctx).proj_blind.magnitude;
            psVar45 = (secp256k1_context *)&(psVar45->ecmult_gen_ctx).ge_offset.infinity;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          puStack_1e40 = auStack_1090;
          uStack_1e68 = 0;
          puStack_1e38 = (undefined1 *)0x0;
          do {
            bVar55 = true;
            if ((ulong)num_cores != 1) {
              puStack_1e38 = puStack_1e38 + -0x18fc812e5f4bd725;
              bVar55 = (uint32_t)
                       (((ulong)puStack_1e38 >> 0x20 ^ (ulong)puStack_1e38 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar55) {
              lVar12 = uStack_1e68 * 0x98;
              secp256k1_fe_inv((secp256k1_fe *)auStack_1b10,
                               (secp256k1_fe *)(auStack_b40 + lVar12 + 0x60));
              lVar32 = 0;
              puVar38 = puStack_1e40;
              uVar11 = uStack_1e68;
              do {
                psVar14 = (secp256k1_ge *)(puVar38 + (uVar11 / 0xd) * -0x548);
                psVar28 = (secp256k1_gej *)(auStack_b40 + lVar32);
                secp256k1_gej_add_var
                          ((secp256k1_gej *)asStack_1810,psVar28,
                           (secp256k1_gej *)(auStack_b40 + lVar12),
                           (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
                iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1810,psVar14);
                if (iVar7 == 0) {
                  main_cold_64();
LAB_00114a4a:
                  main_cold_63();
LAB_00114a4f:
                  main_cold_62();
LAB_00114a54:
                  main_cold_9();
                  goto LAB_00114a59;
                }
                if (uStack_1e68 != 0) {
                  secp256k1_gej_add_ge
                            ((secp256k1_gej *)asStack_1810,psVar28,
                             (secp256k1_ge *)(auStack_1090 + uStack_1e68 * 0x68));
                  iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1810,psVar14);
                  if (iVar7 != 0) goto LAB_0011289f;
                  goto LAB_00114a54;
                }
LAB_0011289f:
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)asStack_1810,psVar28,
                           (secp256k1_ge *)(auStack_1090 + uStack_1e68 * 0x68),(secp256k1_fe *)0x0);
                iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1810,psVar14);
                if (iVar7 == 0) goto LAB_00114a4a;
                iStack_1330 = *(int *)(auStack_b40 + lVar12 + 0x90);
                uStack_1370 = *(uint64_t *)(auStack_b40 + lVar12 + 0x20);
                uStack_1368 = *(uint64_t *)(auStack_b40 + lVar12 + 0x28);
                auStack_1380._8_8_ = *(undefined8 *)(auStack_b40 + lVar12 + 0x18);
                auStack_1380._0_8_ = *(undefined8 *)(auStack_b40 + lVar12 + 0x10);
                auStack_1390._8_8_ = *(undefined8 *)(auStack_b40 + lVar12 + 8);
                auStack_1390._0_8_ = (((secp256k1_gej *)(auStack_b40 + lVar12))->x).n[0];
                auStack_1360._0_8_ = *(undefined8 *)(auStack_b40 + lVar12 + 0x30);
                auStack_1360._8_8_ = *(undefined8 *)(auStack_b40 + lVar12 + 0x38);
                auStack_1360._16_16_ = *(undefined1 (*) [16])(auStack_b40 + lVar12 + 0x40);
                uStack_1340 = *(undefined4 *)(auStack_b40 + lVar12 + 0x50);
                uStack_133c = *(undefined4 *)(auStack_b40 + lVar12 + 0x54);
                iStack_1338 = *(int *)(auStack_b40 + lVar12 + 0x58);
                iStack_1334 = *(int *)(auStack_b40 + lVar12 + 0x5c);
                secp256k1_gej_add_zinv_var
                          ((secp256k1_gej *)asStack_1810,psVar28,(secp256k1_ge *)auStack_1390,
                           (secp256k1_fe *)auStack_1b10);
                iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1810,psVar14);
                if (iVar7 == 0) goto LAB_00114a4f;
                lVar32 = lVar32 + 0x98;
                puVar38 = puVar38 + 0x68;
                uVar11 = uVar11 + 1;
              } while (lVar32 != 0x7b8);
            }
            uStack_1e68 = uStack_1e68 + 1;
            puStack_1e40 = puStack_1e40 + 0x68;
          } while (uStack_1e68 != 0xd);
          uVar11 = 0;
          puVar38 = auStack_1090;
          lVar12 = 0;
          do {
            psVar45 = asStack_1810;
            secp256k1_gej_double((secp256k1_gej *)psVar45,(secp256k1_gej *)(auStack_b40 + lVar12));
            psVar16 = psVar45;
            iVar7 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)psVar45,
                               (secp256k1_ge *)(puVar38 + (uVar11 / 0xd) * -0x548));
            if (iVar7 == 0) goto LAB_00114a9d;
            secp256k1_gej_double_var
                      ((secp256k1_gej *)psVar45,(secp256k1_gej *)(auStack_b40 + lVar12),
                       (secp256k1_fe *)0x0);
            iVar7 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)psVar45,
                               (secp256k1_ge *)(puVar38 + (uVar11 / 0xd) * -0x548));
            if (iVar7 == 0) goto LAB_00114aa2;
            lVar12 = lVar12 + 0x98;
            puVar38 = puVar38 + 0xd0;
            uVar11 = uVar11 + 2;
          } while (lVar12 != 0x7b8);
          lVar12 = 0x68;
          psVar14 = &sStack_bb0;
          psVar28 = (secp256k1_gej *)(auStack_b40 + 0x98);
          do {
            psVar45 = (secp256k1_context *)auStack_1390;
            secp256k1_ge_neg((secp256k1_ge *)psVar45,(secp256k1_ge *)(auStack_1090 + lVar12));
            iVar7 = secp256k1_ge_eq_var((secp256k1_ge *)psVar45,psVar14);
            if (iVar7 == 0) goto LAB_00114aa7;
            secp256k1_gej_neg((secp256k1_gej *)asStack_1810,psVar28);
            psVar45 = asStack_1810;
            iVar7 = secp256k1_gej_eq_ge_var((secp256k1_gej *)asStack_1810,psVar14);
            if (iVar7 == 0) goto LAB_00114aac;
            lVar12 = lVar12 + 0x68;
            psVar28 = psVar28 + 1;
            psVar14 = psVar14 + -1;
          } while (lVar12 != 0x548);
          puVar38 = (undefined1 *)0x1;
          uStack_1e60 = 0x68;
          psStack_1e30 = (secp256k1_gej *)0x0;
LAB_00112ac6:
          lVar12 = (long)puVar38 * 0x98;
          pFStack_1e70 = (FILE *)0x0;
          puStack_1e38 = auStack_1090;
          puStack_1e40 = puVar38;
          while( true ) {
            bVar55 = true;
            if ((ulong)num_cores != 1) {
              psStack_1e30 = (secp256k1_gej *)((long)psStack_1e30[-0x2a150f76858d35].y.n + 0x23);
              bVar55 = (uint32_t)
                       (((ulong)psStack_1e30 >> 0x20 ^ (ulong)psStack_1e30 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar55) break;
LAB_00112c17:
            pFStack_1e70 = (FILE *)((long)&pFStack_1e70->_flags + 1);
            puStack_1e38 = puStack_1e38 + 0x68;
            if ((int)pFStack_1e70 == 0xd) goto code_r0x00112c31;
          }
          iVar7 = 0;
          puVar33 = puStack_1e38;
          __stream = pFStack_1e70;
          while( true ) {
            auStack_1d90._0_4_ = iVar7;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1d90);
            auStack_1dc0._0_4_ = (int)pFStack_1e70;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_1dc0);
            auStack_1e00._8_8_ = auStack_1390;
            auStack_1e00._0_8_ = auStack_1b10;
            auStack_1df0._0_8_ = asStack_1810;
            na = (secp256k1_scratch *)auStack_1d90;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)auStack_1e00,(secp256k1_gej *)auStack_1cb0,1,
                       (secp256k1_gej *)(auStack_b40 + lVar12),(secp256k1_scalar *)na,
                       (secp256k1_scalar *)auStack_1dc0);
            iVar8 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)auStack_1cb0,
                               (secp256k1_ge *)(puVar33 + ((ulong)__stream / 0xd) * -0x548));
            if (iVar8 == 0) break;
            iVar7 = iVar7 + 1;
            puVar33 = puVar33 + uStack_1e60;
            __stream = (FILE *)((long)&__stream->_flags + (long)puStack_1e40);
            puVar38 = puStack_1e40;
            if (iVar7 == 0xd) goto LAB_00112c17;
          }
          main_cold_57();
LAB_00114a33:
          main_cold_1();
LAB_00111f07:
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          goto LAB_00111f14;
        }
        goto LAB_00114aca;
      }
      goto LAB_00114aed;
    }
    goto LAB_00114ae8;
  }
LAB_00114ae3:
  main_cold_74();
LAB_00114ae8:
  main_cold_73();
LAB_00114aed:
  main_cold_72();
LAB_00114af2:
  main_cold_11();
LAB_00114af7:
  main_cold_12();
LAB_00114afc:
  main_cold_13();
LAB_00114b01:
  main_cold_14();
LAB_00114b06:
  main_cold_10();
LAB_00114b0b:
  main_cold_15();
LAB_00114b10:
  main_cold_16();
LAB_00114b15:
  main_cold_49();
LAB_00114b1a:
  main_cold_17();
LAB_00114b1f:
  main_cold_18();
LAB_00114b24:
  main_cold_19();
LAB_00114b29:
  main_cold_20();
LAB_00114b2e:
  main_cold_21();
LAB_00114b33:
  main_cold_48();
LAB_00114b38:
  main_cold_47();
LAB_00114b3d:
  main_cold_46();
LAB_00114b42:
  main_cold_45();
LAB_00114b47:
  main_cold_44();
LAB_00114b4c:
  main_cold_43();
LAB_00114b51:
  main_cold_22();
LAB_00114b56:
  main_cold_42();
LAB_00114b5b:
  main_cold_23();
LAB_00114b60:
  main_cold_41();
LAB_00114b65:
  main_cold_24();
LAB_00114b6a:
  main_cold_40();
LAB_00114b6f:
  main_cold_39();
LAB_00114b74:
  main_cold_25();
LAB_00114b79:
  main_cold_26();
LAB_00114b7e:
  main_cold_27();
LAB_00114b83:
  main_cold_28();
LAB_00114b88:
  main_cold_38();
LAB_00114b8d:
  main_cold_37();
LAB_00114b92:
  main_cold_36();
LAB_00114b97:
  main_cold_35();
LAB_00114b9c:
  main_cold_29();
LAB_00114ba1:
  main_cold_30();
LAB_00114ba6:
  main_cold_31();
LAB_00114bab:
  main_cold_32();
LAB_00114bb0:
  main_cold_34();
LAB_00114bb5:
  main_cold_33();
  lVar12 = 0;
  do {
    uVar47 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar35 = secp256k1_test_state[1] << 0x11;
    uVar24 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar11 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar24;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar11;
    secp256k1_test_state[3] = uVar11 << 0x2d | uVar11 >> 0x13;
    secp256k1_test_state[2] = uVar24 ^ uVar35;
    (psVar45->ecmult_gen_ctx).ge_offset.x.n[lVar12 + -1] = uVar47;
    lVar12 = lVar12 + 1;
  } while ((int)lVar12 != 4);
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_frac_var(secp256k1_fe *xn, secp256k1_fe *xd, const secp256k1_fe *u, const secp256k1_fe *t) {
    /* The implemented algorithm is the following (all operations in GF(p)):
     *
     * - Let c0 = sqrt(-3) = 0xa2d2ba93507f1df233770c2a797962cc61f6d15da14ecd47d8d27ae1cd5f852.
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - If u^3+7+t^2 = 0, set t = 2*t.
     * - Let X = (u^3+7-t^2)/(2*t).
     * - Let Y = (X+t)/(c0*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = (X/Y-u)/2 (which is now guaranteed to be a valid x coordinate).
     *
     * Introducing s=t^2, g=u^3+7, and simplifying x1=-(x2+u) we get:
     *
     * - Let c0 = ...
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - Let s = t^2
     * - Let g = u^3+7
     * - If g+s = 0, set t = 2*t, s = 4*s
     * - Let X = (g-s)/(2*t).
     * - Let Y = (X+t)/(c0*u) = (g+s)/(2*c0*t*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Now substitute Y^2 = -(g+s)^2/(12*s*u^2) and X/Y = c0*u*(g-s)/(g+s). This
     * means X and Y do not need to be evaluated explicitly anymore.
     *
     * - ...
     * - If g+s = 0, set s = 4*s.
     * - If x3 = u-(g+s)^2/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = (-c0*u*(g-s)/(g+s)-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Simplifying x2 using 2 additional constants:
     *
     * - Let c1 = (c0-1)/2 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = (-c0-1)/2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - ...
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - ...
     *
     * Writing x3 as a fraction:
     *
     * - ...
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) ...
     * - ...

     * Overall, we get:
     *
     * - Let c1 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - If u = 0, set u = 1.
     * - If t = 0, set s = 1, else set s = t^2.
     * - Let g = u^3+7.
     * - If g+s = 0, set s = 4*s.
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     */
    secp256k1_fe u1, s, g, p, d, n, l;
    u1 = *u;
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&u1), 0)) u1 = secp256k1_fe_one;
    secp256k1_fe_sqr(&s, t);
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(t), 0)) s = secp256k1_fe_one;
    secp256k1_fe_sqr(&l, &u1);                                   /* l = u^2 */
    secp256k1_fe_mul(&g, &l, &u1);                               /* g = u^3 */
    secp256k1_fe_add_int(&g, SECP256K1_B);                       /* g = u^3 + 7 */
    p = g;                                                       /* p = g */
    secp256k1_fe_add(&p, &s);                                    /* p = g+s */
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&p), 0)) {
        secp256k1_fe_mul_int(&s, 4);
        /* Recompute p = g+s */
        p = g;                                                   /* p = g */
        secp256k1_fe_add(&p, &s);                                /* p = g+s */
    }
    secp256k1_fe_mul(&d, &s, &l);                                /* d = s*u^2 */
    secp256k1_fe_mul_int(&d, 3);                                 /* d = 3*s*u^2 */
    secp256k1_fe_sqr(&l, &p);                                    /* l = (g+s)^2 */
    secp256k1_fe_negate(&l, &l, 1);                              /* l = -(g+s)^2 */
    secp256k1_fe_mul(&n, &d, &u1);                               /* n = 3*s*u^3 */
    secp256k1_fe_add(&n, &l);                                    /* n = 3*s*u^3-(g+s)^2 */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &d)) {
        /* Return x3 = n/d = (3*s*u^3-(g+s)^2)/(3*s*u^2) */
        *xn = n;
        *xd = d;
        return;
    }
    *xd = p;
    secp256k1_fe_mul(&l, &secp256k1_ellswift_c1, &s);            /* l = c1*s */
    secp256k1_fe_mul(&n, &secp256k1_ellswift_c2, &g);            /* n = c2*g */
    secp256k1_fe_add(&n, &l);                                    /* n = c1*s+c2*g */
    secp256k1_fe_mul(&n, &n, &u1);                               /* n = u*(c1*s+c2*g) */
    /* Possible optimization: in the invocation below, p^2 = (g+s)^2 is computed,
     * which we already have computed above. This could be deduplicated. */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &p)) {
        /* Return x2 = n/p = u*(c1*s+c2*g)/(g+s) */
        *xn = n;
        return;
    }
    secp256k1_fe_mul(&l, &p, &u1);                               /* l = u*(g+s) */
    secp256k1_fe_add(&n, &l);                                    /* n = u*(c1*s+c2*g)+u*(g+s) */
    secp256k1_fe_negate(xn, &n, 2);                              /* n = -u*(c1*s+c2*g)-u*(g+s) */

    VERIFY_CHECK(secp256k1_ge_x_frac_on_curve_var(xn, &p));
    /* Return x3 = n/p = -(u*(c1*s+c2*g)/(g+s)+u) */
}